

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<8>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  ulong uVar63;
  byte bVar64;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar122;
  uint uVar123;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  uint uVar124;
  uint uVar128;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float pp;
  float fVar129;
  undefined4 uVar130;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar131;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar132 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  undefined1 auVar228 [28];
  undefined1 auVar229 [64];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8f8;
  undefined2 local_8f2;
  ulong local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8b0 [8];
  float fStack_8a8;
  float fStack_8a4;
  RTCFilterFunctionNArguments local_8a0;
  undefined4 local_86c;
  uint local_868;
  int local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_610;
  float local_608;
  float local_604;
  undefined4 local_600;
  uint local_5fc;
  uint local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  Primitive *local_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar113 [32];
  
  PVar8 = prim[1];
  uVar65 = (ulong)(byte)PVar8;
  fVar145 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar80 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  fVar188 = fVar145 * auVar80._0_4_;
  fVar129 = fVar145 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar65 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar65 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar75);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar65 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar77);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar76);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar93 = vpmovsxbd_avx2(auVar72);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar93);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar65 + 6);
  auVar85 = vpmovsxbd_avx2(auVar78);
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar67 = (ulong)(uint)((int)(uVar65 * 9) * 2);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar90 = vpmovsxbd_avx2(auVar73);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar67 + uVar65 + 6);
  auVar91 = vpmovsxbd_avx2(auVar79);
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar63 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar63 + 6);
  auVar83 = vpmovsxbd_avx2(auVar7);
  auVar92 = vcvtdq2ps_avx(auVar83);
  auVar103._4_4_ = fVar129;
  auVar103._0_4_ = fVar129;
  auVar103._8_4_ = fVar129;
  auVar103._12_4_ = fVar129;
  auVar103._16_4_ = fVar129;
  auVar103._20_4_ = fVar129;
  auVar103._24_4_ = fVar129;
  auVar103._28_4_ = fVar129;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar145 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar145 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar145 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar129))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar82 = vpermps_avx512vl(auVar81,auVar95);
  fVar129 = auVar82._0_4_;
  fVar156 = auVar82._4_4_;
  auVar95._4_4_ = fVar156 * auVar87._4_4_;
  auVar95._0_4_ = fVar129 * auVar87._0_4_;
  fVar158 = auVar82._8_4_;
  auVar95._8_4_ = fVar158 * auVar87._8_4_;
  fVar131 = auVar82._12_4_;
  auVar95._12_4_ = fVar131 * auVar87._12_4_;
  fVar160 = auVar82._16_4_;
  auVar95._16_4_ = fVar160 * auVar87._16_4_;
  fVar162 = auVar82._20_4_;
  auVar95._20_4_ = fVar162 * auVar87._20_4_;
  fVar164 = auVar82._24_4_;
  auVar95._24_4_ = fVar164 * auVar87._24_4_;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar85._4_4_ * fVar156;
  auVar93._0_4_ = auVar85._0_4_ * fVar129;
  auVar93._8_4_ = auVar85._8_4_ * fVar158;
  auVar93._12_4_ = auVar85._12_4_ * fVar131;
  auVar93._16_4_ = auVar85._16_4_ * fVar160;
  auVar93._20_4_ = auVar85._20_4_ * fVar162;
  auVar93._24_4_ = auVar85._24_4_ * fVar164;
  auVar93._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar92._4_4_ * fVar156;
  auVar83._0_4_ = auVar92._0_4_ * fVar129;
  auVar83._8_4_ = auVar92._8_4_ * fVar158;
  auVar83._12_4_ = auVar92._12_4_ * fVar131;
  auVar83._16_4_ = auVar92._16_4_ * fVar160;
  auVar83._20_4_ = auVar92._20_4_ * fVar162;
  auVar83._24_4_ = auVar92._24_4_ * fVar164;
  auVar83._28_4_ = auVar82._28_4_;
  auVar74 = vfmadd231ps_fma(auVar95,auVar94,auVar84);
  auVar75 = vfmadd231ps_fma(auVar93,auVar94,auVar89);
  auVar77 = vfmadd231ps_fma(auVar83,auVar91,auVar94);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar103,auVar86);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar103,auVar88);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar90,auVar103);
  auVar205._4_4_ = fVar188;
  auVar205._0_4_ = fVar188;
  auVar205._8_4_ = fVar188;
  auVar205._12_4_ = fVar188;
  auVar205._16_4_ = fVar188;
  auVar205._20_4_ = fVar188;
  auVar205._24_4_ = fVar188;
  auVar205._28_4_ = fVar188;
  auVar83 = ZEXT1632(CONCAT412(fVar145 * auVar80._12_4_,
                               CONCAT48(fVar145 * auVar80._8_4_,
                                        CONCAT44(fVar145 * auVar80._4_4_,fVar188))));
  auVar93 = vpermps_avx2(auVar105,auVar83);
  auVar83 = vpermps_avx512vl(auVar81,auVar83);
  fVar145 = auVar83._0_4_;
  fVar129 = auVar83._4_4_;
  auVar94._4_4_ = fVar129 * auVar87._4_4_;
  auVar94._0_4_ = fVar145 * auVar87._0_4_;
  fVar156 = auVar83._8_4_;
  auVar94._8_4_ = fVar156 * auVar87._8_4_;
  fVar158 = auVar83._12_4_;
  auVar94._12_4_ = fVar158 * auVar87._12_4_;
  fVar131 = auVar83._16_4_;
  auVar94._16_4_ = fVar131 * auVar87._16_4_;
  fVar160 = auVar83._20_4_;
  auVar94._20_4_ = fVar160 * auVar87._20_4_;
  fVar162 = auVar83._24_4_;
  auVar94._24_4_ = fVar162 * auVar87._24_4_;
  auVar94._28_4_ = 1;
  auVar81._4_4_ = auVar85._4_4_ * fVar129;
  auVar81._0_4_ = auVar85._0_4_ * fVar145;
  auVar81._8_4_ = auVar85._8_4_ * fVar156;
  auVar81._12_4_ = auVar85._12_4_ * fVar158;
  auVar81._16_4_ = auVar85._16_4_ * fVar131;
  auVar81._20_4_ = auVar85._20_4_ * fVar160;
  auVar81._24_4_ = auVar85._24_4_ * fVar162;
  auVar81._28_4_ = auVar87._28_4_;
  auVar85._4_4_ = auVar92._4_4_ * fVar129;
  auVar85._0_4_ = auVar92._0_4_ * fVar145;
  auVar85._8_4_ = auVar92._8_4_ * fVar156;
  auVar85._12_4_ = auVar92._12_4_ * fVar158;
  auVar85._16_4_ = auVar92._16_4_ * fVar131;
  auVar85._20_4_ = auVar92._20_4_ * fVar160;
  auVar85._24_4_ = auVar92._24_4_ * fVar162;
  auVar85._28_4_ = auVar83._28_4_;
  auVar76 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar72 = vfmadd231ps_fma(auVar81,auVar93,auVar89);
  auVar78 = vfmadd231ps_fma(auVar85,auVar93,auVar91);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar205,auVar86);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar205,auVar88);
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar205,auVar90);
  auVar86 = vandps_avx(ZEXT1632(auVar74),auVar100);
  auVar102._8_4_ = 0x219392ef;
  auVar102._0_8_ = 0x219392ef219392ef;
  auVar102._12_4_ = 0x219392ef;
  auVar102._16_4_ = 0x219392ef;
  auVar102._20_4_ = 0x219392ef;
  auVar102._24_4_ = 0x219392ef;
  auVar102._28_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar86,auVar102,1);
  bVar12 = (bool)((byte)uVar67 & 1);
  auVar82._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._0_4_;
  bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._4_4_;
  bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._8_4_;
  bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar74._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar75),auVar100);
  uVar67 = vcmpps_avx512vl(auVar86,auVar102,1);
  bVar12 = (bool)((byte)uVar67 & 1);
  auVar96._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._0_4_;
  bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._4_4_;
  bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._8_4_;
  bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar75._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar77),auVar100);
  uVar67 = vcmpps_avx512vl(auVar86,auVar102,1);
  bVar12 = (bool)((byte)uVar67 & 1);
  auVar86._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._0_4_;
  bVar12 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._4_4_;
  bVar12 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._8_4_;
  bVar12 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar82,auVar84,auVar101);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar96);
  auVar75 = vfnmadd213ps_fma(auVar96,auVar84,auVar101);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar77 = vfnmadd213ps_fma(auVar86,auVar84,auVar101);
  auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar84,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar90._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar90._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar90._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar90._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar90._16_4_ = auVar86._16_4_ * 0.0;
  auVar90._20_4_ = auVar86._20_4_ * 0.0;
  auVar90._24_4_ = auVar86._24_4_ * 0.0;
  auVar90._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar85 = vpbroadcastd_avx512vl();
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar99._0_4_ = auVar74._0_4_ * auVar86._0_4_;
  auVar99._4_4_ = auVar74._4_4_ * auVar86._4_4_;
  auVar99._8_4_ = auVar74._8_4_ * auVar86._8_4_;
  auVar99._12_4_ = auVar74._12_4_ * auVar86._12_4_;
  auVar99._16_4_ = auVar86._16_4_ * 0.0;
  auVar99._20_4_ = auVar86._20_4_ * 0.0;
  auVar99._24_4_ = auVar86._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar8 * 0x10 + uVar65 * -2 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar72));
  auVar91._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar86 = vcvtdq2ps_avx(auVar84);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar72));
  auVar98._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar98._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar98._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar98._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar98._16_4_ = auVar86._16_4_ * 0.0;
  auVar98._20_4_ = auVar86._20_4_ * 0.0;
  auVar98._24_4_ = auVar86._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar63 + uVar65 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar78));
  auVar92._4_4_ = auVar86._4_4_ * auVar77._4_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar77._0_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar77._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar77._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar78));
  auVar97._0_4_ = auVar77._0_4_ * auVar86._0_4_;
  auVar97._4_4_ = auVar77._4_4_ * auVar86._4_4_;
  auVar97._8_4_ = auVar77._8_4_ * auVar86._8_4_;
  auVar97._12_4_ = auVar77._12_4_ * auVar86._12_4_;
  auVar97._16_4_ = auVar86._16_4_ * 0.0;
  auVar97._20_4_ = auVar86._20_4_ * 0.0;
  auVar97._24_4_ = auVar86._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar90,auVar99);
  auVar84 = vpminsd_avx2(auVar91,auVar98);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar97);
  uVar130 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar87._4_4_ = uVar130;
  auVar87._0_4_ = uVar130;
  auVar87._8_4_ = uVar130;
  auVar87._12_4_ = uVar130;
  auVar87._16_4_ = uVar130;
  auVar87._20_4_ = uVar130;
  auVar87._24_4_ = uVar130;
  auVar87._28_4_ = uVar130;
  auVar84 = vmaxps_avx512vl(auVar84,auVar87);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_220 = vmulps_avx512vl(auVar86,auVar84);
  auVar86 = vpmaxsd_avx2(auVar90,auVar99);
  auVar84 = vpmaxsd_avx2(auVar91,auVar98);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar97);
  fVar145 = (ray->super_RayK<1>).tfar;
  auVar88._4_4_ = fVar145;
  auVar88._0_4_ = fVar145;
  auVar88._8_4_ = fVar145;
  auVar88._12_4_ = fVar145;
  auVar88._16_4_ = fVar145;
  auVar88._20_4_ = fVar145;
  auVar88._24_4_ = fVar145;
  auVar88._28_4_ = fVar145;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar22 = vpcmpgtd_avx512vl(auVar85,_DAT_01fe9900);
  uVar20 = vcmpps_avx512vl(local_220,auVar86,2);
  if ((byte)((byte)uVar20 & (byte)uVar22) == 0) {
    return;
  }
  uVar67 = (ulong)(byte)((byte)uVar20 & (byte)uVar22);
  local_4a8 = prim;
LAB_01d3fe7e:
  lVar66 = 0;
  for (uVar63 = uVar67; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  local_8f0 = (ulong)*(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8e8 = (ulong)*(uint *)(prim + lVar66 * 4 + 6);
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar66 * 4 + 6));
  p_Var10 = pGVar9[1].intersectionFilterN;
  lVar66 = *(long *)&pGVar9[1].time_range.upper;
  auVar74 = *(undefined1 (*) [16])(lVar66 + (long)p_Var10 * uVar63);
  auVar75 = *(undefined1 (*) [16])(lVar66 + (uVar63 + 1) * (long)p_Var10);
  auVar77 = *(undefined1 (*) [16])(lVar66 + (uVar63 + 2) * (long)p_Var10);
  uVar67 = uVar67 - 1 & uVar67;
  auVar76 = *(undefined1 (*) [16])(lVar66 + (uVar63 + 3) * (long)p_Var10);
  if (uVar67 != 0) {
    uVar65 = uVar67 - 1 & uVar67;
    for (uVar63 = uVar67; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    }
    if (uVar65 != 0) {
      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar207._0_4_ = auVar74._0_4_ + auVar75._0_4_ + auVar77._0_4_ + auVar76._0_4_;
  auVar207._4_4_ = auVar74._4_4_ + auVar75._4_4_ + auVar77._4_4_ + auVar76._4_4_;
  auVar207._8_4_ = auVar74._8_4_ + auVar75._8_4_ + auVar77._8_4_ + auVar76._8_4_;
  auVar207._12_4_ = auVar74._12_4_ + auVar75._12_4_ + auVar77._12_4_ + auVar76._12_4_;
  aVar5 = (ray->super_RayK<1>).org.field_0;
  aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar80._8_4_ = 0x3e800000;
  auVar80._0_8_ = 0x3e8000003e800000;
  auVar80._12_4_ = 0x3e800000;
  auVar72 = vmulps_avx512vl(auVar207,auVar80);
  auVar72 = vsubps_avx(auVar72,(undefined1  [16])aVar5);
  auVar72 = vdpps_avx(auVar72,(undefined1  [16])aVar6,0x7f);
  auVar78 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
  auVar226._4_12_ = ZEXT812(0) << 0x20;
  auVar226._0_4_ = auVar78._0_4_;
  auVar73 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
  auVar78 = vfnmadd213ss_fma(auVar73,auVar78,ZEXT416(0x40000000));
  fVar145 = auVar72._0_4_ * auVar73._0_4_ * auVar78._0_4_;
  local_510 = ZEXT416((uint)fVar145);
  auVar208._4_4_ = fVar145;
  auVar208._0_4_ = fVar145;
  auVar208._8_4_ = fVar145;
  auVar208._12_4_ = fVar145;
  fStack_590 = fVar145;
  _local_5a0 = auVar208;
  fStack_58c = fVar145;
  fStack_588 = fVar145;
  fStack_584 = fVar145;
  auVar72 = vfmadd231ps_fma((undefined1  [16])aVar5,(undefined1  [16])aVar6,auVar208);
  auVar72 = vblendps_avx(auVar72,ZEXT816(0) << 0x40,8);
  auVar74 = vsubps_avx(auVar74,auVar72);
  local_640 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[0]));
  auVar245 = ZEXT3264(local_640);
  auVar77 = vsubps_avx(auVar77,auVar72);
  auVar84 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]));
  auVar248 = ZEXT3264(auVar84);
  local_7a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]));
  auVar247 = ZEXT3264(local_7a0);
  auVar75 = vsubps_avx(auVar75,auVar72);
  auVar76 = vsubps_avx(auVar76,auVar72);
  uVar130 = auVar74._0_4_;
  local_720._4_4_ = uVar130;
  local_720._0_4_ = uVar130;
  local_720._8_4_ = uVar130;
  local_720._12_4_ = uVar130;
  local_720._16_4_ = uVar130;
  local_720._20_4_ = uVar130;
  local_720._24_4_ = uVar130;
  local_720._28_4_ = uVar130;
  auVar227 = ZEXT3264(local_720);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_420 = ZEXT1632(auVar74);
  local_740 = vpermps_avx2(auVar106,local_420);
  auVar229 = ZEXT3264(local_740);
  auVar109._8_4_ = 2;
  auVar109._0_8_ = 0x200000002;
  auVar109._12_4_ = 2;
  auVar109._16_4_ = 2;
  auVar109._20_4_ = 2;
  auVar109._24_4_ = 2;
  auVar109._28_4_ = 2;
  local_760 = vpermps_avx2(auVar109,local_420);
  auVar231 = ZEXT3264(local_760);
  auVar110._8_4_ = 3;
  auVar110._0_8_ = 0x300000003;
  auVar110._12_4_ = 3;
  auVar110._16_4_ = 3;
  auVar110._20_4_ = 3;
  auVar110._24_4_ = 3;
  auVar110._28_4_ = 3;
  local_780 = vpermps_avx2(auVar110,local_420);
  auVar234 = ZEXT3264(local_780);
  uVar130 = auVar75._0_4_;
  local_3e0._4_4_ = uVar130;
  local_3e0._0_4_ = uVar130;
  local_3e0._8_4_ = uVar130;
  local_3e0._12_4_ = uVar130;
  local_3e0._16_4_ = uVar130;
  local_3e0._20_4_ = uVar130;
  local_3e0._24_4_ = uVar130;
  local_3e0._28_4_ = uVar130;
  auVar220 = ZEXT3264(local_3e0);
  local_460 = ZEXT1632(auVar75);
  local_400 = vpermps_avx2(auVar106,local_460);
  local_7c0 = vpermps_avx512vl(auVar109,local_460);
  auVar251 = ZEXT3264(local_7c0);
  local_7e0 = vpermps_avx2(auVar110,local_460);
  auVar238 = ZEXT3264(local_7e0);
  local_800 = vbroadcastss_avx512vl(auVar77);
  auVar239 = ZEXT3264(local_800);
  local_440 = ZEXT1632(auVar77);
  local_680 = vpermps_avx512vl(auVar106,local_440);
  auVar240 = ZEXT3264(local_680);
  local_6a0 = vpermps_avx512vl(auVar109,local_440);
  auVar241 = ZEXT3264(local_6a0);
  local_820 = vpermps_avx512vl(auVar110,local_440);
  auVar242 = ZEXT3264(local_820);
  local_6c0 = vbroadcastss_avx512vl(auVar76);
  auVar243 = ZEXT3264(local_6c0);
  _local_480 = ZEXT1632(auVar76);
  local_840 = vpermps_avx512vl(auVar106,_local_480);
  auVar244 = ZEXT3264(local_840);
  local_6e0 = vpermps_avx512vl(auVar109,_local_480);
  auVar246 = ZEXT3264(local_6e0);
  local_860 = vpermps_avx512vl(auVar110,_local_480);
  auVar249 = ZEXT3264(local_860);
  auVar206 = ZEXT3264(local_400);
  auVar86 = vpermps_avx2(auVar109,ZEXT1632(CONCAT412(aVar6.field_3.w * aVar6.field_3.w,
                                                     CONCAT48(aVar6.z * aVar6.z,
                                                              CONCAT44(aVar6.y * aVar6.y,
                                                                       aVar6.x * aVar6.x)))));
  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar84);
  local_1e0 = vfmadd231ps_avx512vl(auVar86,local_640,local_640);
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar104);
  local_200 = local_1e0;
  local_864 = 1;
  uVar63 = 0;
  local_2f0 = ZEXT816(0x3f80000000000000);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar250 = ZEXT3264(auVar86);
  do {
    auVar74 = vmovshdup_avx(local_2f0);
    auVar74 = vsubps_avx(auVar74,local_2f0);
    fVar145 = auVar74._0_4_;
    fVar131 = fVar145 * 0.04761905;
    local_8e0._0_4_ = local_2f0._0_4_;
    local_8e0._4_4_ = local_8e0._0_4_;
    fStack_8d8 = (float)local_8e0._0_4_;
    fStack_8d4 = (float)local_8e0._0_4_;
    register0x000012d0 = local_8e0._0_4_;
    register0x000012d4 = local_8e0._0_4_;
    register0x000012d8 = local_8e0._0_4_;
    register0x000012dc = local_8e0._0_4_;
    auVar209._4_4_ = fVar145;
    auVar209._0_4_ = fVar145;
    auVar209._8_4_ = fVar145;
    auVar209._12_4_ = fVar145;
    local_700._16_4_ = fVar145;
    local_700._0_16_ = auVar209;
    local_700._20_4_ = fVar145;
    local_700._24_4_ = fVar145;
    local_700._28_4_ = fVar145;
    auVar74 = vfmadd231ps_fma(_local_8e0,local_700,_DAT_01faff20);
    auVar105 = auVar250._0_32_;
    auVar86 = vsubps_avx512vl(auVar105,ZEXT1632(auVar74));
    fVar145 = auVar74._0_4_;
    fVar129 = auVar74._4_4_;
    auVar60._4_4_ = auVar220._4_4_ * fVar129;
    auVar60._0_4_ = auVar220._0_4_ * fVar145;
    fVar156 = auVar74._8_4_;
    auVar60._8_4_ = auVar220._8_4_ * fVar156;
    fVar158 = auVar74._12_4_;
    auVar60._12_4_ = auVar220._12_4_ * fVar158;
    auVar60._16_4_ = auVar220._16_4_ * 0.0;
    auVar60._20_4_ = auVar220._20_4_ * 0.0;
    auVar60._24_4_ = auVar220._24_4_ * 0.0;
    auVar60._28_4_ = DAT_01faff20._28_4_;
    auVar42._4_4_ = auVar206._4_4_ * fVar129;
    auVar42._0_4_ = auVar206._0_4_ * fVar145;
    auVar42._8_4_ = auVar206._8_4_ * fVar156;
    auVar42._12_4_ = auVar206._12_4_ * fVar158;
    auVar42._16_4_ = auVar206._16_4_ * 0.0;
    auVar42._20_4_ = auVar206._20_4_ * 0.0;
    auVar42._24_4_ = auVar206._24_4_ * 0.0;
    auVar42._28_4_ = local_8e0._0_4_;
    auVar84 = vmulps_avx512vl(auVar251._0_32_,ZEXT1632(auVar74));
    auVar221._0_4_ = auVar238._0_4_ * fVar145;
    auVar221._4_4_ = auVar238._4_4_ * fVar129;
    auVar221._8_4_ = auVar238._8_4_ * fVar156;
    auVar221._12_4_ = auVar238._12_4_ * fVar158;
    auVar221._16_4_ = auVar238._16_4_ * 0.0;
    auVar221._20_4_ = auVar238._20_4_ * 0.0;
    auVar221._28_36_ = auVar220._28_36_;
    auVar221._24_4_ = auVar238._24_4_ * 0.0;
    auVar75 = vfmadd231ps_fma(auVar60,auVar86,auVar227._0_32_);
    auVar77 = vfmadd231ps_fma(auVar42,auVar86,auVar229._0_32_);
    auVar76 = vfmadd231ps_fma(auVar84,auVar86,auVar231._0_32_);
    auVar72 = vfmadd231ps_fma(auVar221._0_32_,auVar86,auVar234._0_32_);
    auVar84 = vmulps_avx512vl(auVar239._0_32_,ZEXT1632(auVar74));
    auVar90 = ZEXT1632(auVar74);
    auVar87 = vmulps_avx512vl(auVar240._0_32_,auVar90);
    auVar88 = vmulps_avx512vl(auVar241._0_32_,auVar90);
    auVar89 = vmulps_avx512vl(auVar242._0_32_,auVar90);
    auVar78 = vfmadd231ps_fma(auVar84,auVar86,auVar220._0_32_);
    auVar73 = vfmadd231ps_fma(auVar87,auVar86,auVar206._0_32_);
    auVar84 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar251._0_32_);
    auVar79 = vfmadd231ps_fma(auVar89,auVar86,auVar238._0_32_);
    auVar87 = vmulps_avx512vl(auVar243._0_32_,auVar90);
    auVar88 = vmulps_avx512vl(auVar244._0_32_,auVar90);
    auVar89 = vmulps_avx512vl(auVar246._0_32_,auVar90);
    auVar85 = vmulps_avx512vl(auVar249._0_32_,auVar90);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar239._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar240._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar241._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,auVar242._0_32_);
    auVar206._28_36_ = auVar238._28_36_;
    auVar206._0_28_ =
         ZEXT1628(CONCAT412(fVar158 * auVar78._12_4_,
                            CONCAT48(fVar156 * auVar78._8_4_,
                                     CONCAT44(fVar129 * auVar78._4_4_,fVar145 * auVar78._0_4_))));
    auVar90 = vmulps_avx512vl(auVar90,ZEXT1632(auVar73));
    auVar91 = vmulps_avx512vl(ZEXT1632(auVar74),auVar84);
    auVar92 = vmulps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar79));
    auVar74 = vfmadd231ps_fma(auVar206._0_32_,auVar86,ZEXT1632(auVar75));
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,ZEXT1632(auVar77));
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar76));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar86,ZEXT1632(auVar72));
    auVar218._0_4_ = auVar87._0_4_ * fVar145;
    auVar218._4_4_ = auVar87._4_4_ * fVar129;
    auVar218._8_4_ = auVar87._8_4_ * fVar156;
    auVar218._12_4_ = auVar87._12_4_ * fVar158;
    auVar218._16_4_ = auVar87._16_4_ * 0.0;
    auVar218._20_4_ = auVar87._20_4_ * 0.0;
    auVar218._24_4_ = auVar87._24_4_ * 0.0;
    auVar218._28_4_ = 0;
    auVar43._4_4_ = auVar88._4_4_ * fVar129;
    auVar43._0_4_ = auVar88._0_4_ * fVar145;
    auVar43._8_4_ = auVar88._8_4_ * fVar156;
    auVar43._12_4_ = auVar88._12_4_ * fVar158;
    auVar43._16_4_ = auVar88._16_4_ * 0.0;
    auVar43._20_4_ = auVar88._20_4_ * 0.0;
    auVar43._24_4_ = auVar88._24_4_ * 0.0;
    auVar43._28_4_ = auVar87._28_4_;
    auVar44._4_4_ = auVar89._4_4_ * fVar129;
    auVar44._0_4_ = auVar89._0_4_ * fVar145;
    auVar44._8_4_ = auVar89._8_4_ * fVar156;
    auVar44._12_4_ = auVar89._12_4_ * fVar158;
    auVar44._16_4_ = auVar89._16_4_ * 0.0;
    auVar44._20_4_ = auVar89._20_4_ * 0.0;
    auVar44._24_4_ = auVar89._24_4_ * 0.0;
    auVar44._28_4_ = auVar88._28_4_;
    auVar45._4_4_ = auVar85._4_4_ * fVar129;
    auVar45._0_4_ = auVar85._0_4_ * fVar145;
    auVar45._8_4_ = auVar85._8_4_ * fVar156;
    auVar45._12_4_ = auVar85._12_4_ * fVar158;
    auVar45._16_4_ = auVar85._16_4_ * 0.0;
    auVar45._20_4_ = auVar85._20_4_ * 0.0;
    auVar45._24_4_ = auVar85._24_4_ * 0.0;
    auVar45._28_4_ = auVar89._28_4_;
    auVar75 = vfmadd231ps_fma(auVar218,auVar86,ZEXT1632(auVar78));
    auVar77 = vfmadd231ps_fma(auVar43,auVar86,ZEXT1632(auVar73));
    auVar76 = vfmadd231ps_fma(auVar44,auVar86,auVar84);
    auVar72 = vfmadd231ps_fma(auVar45,auVar86,ZEXT1632(auVar79));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar158 * auVar75._12_4_,
                                                 CONCAT48(fVar156 * auVar75._8_4_,
                                                          CONCAT44(fVar129 * auVar75._4_4_,
                                                                   fVar145 * auVar75._0_4_)))),
                              auVar86,ZEXT1632(auVar74));
    auVar93 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar158,
                                            CONCAT48(auVar77._8_4_ * fVar156,
                                                     CONCAT44(auVar77._4_4_ * fVar129,
                                                              auVar77._0_4_ * fVar145)))),auVar86,
                         auVar90);
    auVar83 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar76._12_4_ * fVar158,
                                            CONCAT48(auVar76._8_4_ * fVar156,
                                                     CONCAT44(auVar76._4_4_ * fVar129,
                                                              auVar76._0_4_ * fVar145)))),auVar86,
                         auVar91);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar72._12_4_ * fVar158,
                                            CONCAT48(auVar72._8_4_ * fVar156,
                                                     CONCAT44(auVar72._4_4_ * fVar129,
                                                              auVar72._0_4_ * fVar145)))),auVar92,
                         auVar86);
    auVar86 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar74));
    auVar84 = vsubps_avx512vl(ZEXT1632(auVar77),auVar90);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar76),auVar91);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar72),auVar92);
    auVar232._0_4_ = fVar131 * auVar86._0_4_ * 3.0;
    auVar232._4_4_ = fVar131 * auVar86._4_4_ * 3.0;
    auVar232._8_4_ = fVar131 * auVar86._8_4_ * 3.0;
    auVar232._12_4_ = fVar131 * auVar86._12_4_ * 3.0;
    auVar232._16_4_ = fVar131 * auVar86._16_4_ * 3.0;
    auVar232._20_4_ = fVar131 * auVar86._20_4_ * 3.0;
    auVar232._24_4_ = fVar131 * auVar86._24_4_ * 3.0;
    auVar232._28_4_ = 0;
    auVar235._0_4_ = fVar131 * auVar84._0_4_ * 3.0;
    auVar235._4_4_ = fVar131 * auVar84._4_4_ * 3.0;
    auVar235._8_4_ = fVar131 * auVar84._8_4_ * 3.0;
    auVar235._12_4_ = fVar131 * auVar84._12_4_ * 3.0;
    auVar235._16_4_ = fVar131 * auVar84._16_4_ * 3.0;
    auVar235._20_4_ = fVar131 * auVar84._20_4_ * 3.0;
    auVar235._24_4_ = fVar131 * auVar84._24_4_ * 3.0;
    auVar235._28_4_ = 0;
    auVar236._0_4_ = fVar131 * auVar88._0_4_ * 3.0;
    auVar236._4_4_ = fVar131 * auVar88._4_4_ * 3.0;
    auVar236._8_4_ = fVar131 * auVar88._8_4_ * 3.0;
    auVar236._12_4_ = fVar131 * auVar88._12_4_ * 3.0;
    auVar236._16_4_ = fVar131 * auVar88._16_4_ * 3.0;
    auVar236._20_4_ = fVar131 * auVar88._20_4_ * 3.0;
    auVar236._24_4_ = fVar131 * auVar88._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    fVar145 = auVar89._0_4_ * 3.0 * fVar131;
    fVar129 = auVar89._4_4_ * 3.0 * fVar131;
    auVar46._4_4_ = fVar129;
    auVar46._0_4_ = fVar145;
    fVar156 = auVar89._8_4_ * 3.0 * fVar131;
    auVar46._8_4_ = fVar156;
    fVar158 = auVar89._12_4_ * 3.0 * fVar131;
    auVar46._12_4_ = fVar158;
    fVar160 = auVar89._16_4_ * 3.0 * fVar131;
    auVar46._16_4_ = fVar160;
    fVar162 = auVar89._20_4_ * 3.0 * fVar131;
    auVar46._20_4_ = fVar162;
    fVar164 = auVar89._24_4_ * 3.0 * fVar131;
    auVar46._24_4_ = fVar164;
    auVar46._28_4_ = fVar131;
    auVar74 = vxorps_avx512vl(auVar251._0_16_,auVar251._0_16_);
    auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar78),_DAT_01feed00,ZEXT1632(auVar74));
    auVar91 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,ZEXT1632(auVar74));
    auVar88 = ZEXT1632(auVar74);
    auVar92 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar88);
    auVar214._0_4_ = auVar87._0_4_ + fVar145;
    auVar214._4_4_ = auVar87._4_4_ + fVar129;
    auVar214._8_4_ = auVar87._8_4_ + fVar156;
    auVar214._12_4_ = auVar87._12_4_ + fVar158;
    auVar214._16_4_ = auVar87._16_4_ + fVar160;
    auVar214._20_4_ = auVar87._20_4_ + fVar162;
    auVar214._24_4_ = auVar87._24_4_ + fVar164;
    auVar214._28_4_ = auVar87._28_4_ + fVar131;
    auVar86 = vmaxps_avx(auVar87,auVar214);
    auVar84 = vminps_avx(auVar87,auVar214);
    auVar94 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,auVar88);
    auVar95 = vpermt2ps_avx512vl(auVar232,_DAT_01feed00,auVar88);
    auVar81 = vpermt2ps_avx512vl(auVar235,_DAT_01feed00,auVar88);
    auVar104 = ZEXT1632(auVar74);
    auVar82 = vpermt2ps_avx512vl(auVar236,_DAT_01feed00,auVar104);
    auVar87 = vpermt2ps_avx512vl(auVar46,_DAT_01feed00,auVar104);
    auVar87 = vsubps_avx(auVar94,auVar87);
    auVar88 = vsubps_avx(auVar90,ZEXT1632(auVar78));
    auVar89 = vsubps_avx(auVar91,auVar93);
    auVar85 = vsubps_avx(auVar92,auVar83);
    auVar96 = vmulps_avx512vl(auVar89,auVar236);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar235,auVar85);
    auVar97 = vmulps_avx512vl(auVar85,auVar232);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar236,auVar88);
    auVar98 = vmulps_avx512vl(auVar88,auVar235);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar232,auVar89);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar96);
    auVar97 = vmulps_avx512vl(auVar85,auVar85);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,auVar88);
    auVar98 = vrcp14ps_avx512vl(auVar97);
    auVar99 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar105);
    auVar98 = vfmadd132ps_avx512vl(auVar99,auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar96,auVar98);
    auVar99 = vmulps_avx512vl(auVar89,auVar82);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar81,auVar85);
    auVar100 = vmulps_avx512vl(auVar85,auVar95);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar82,auVar88);
    auVar101 = vmulps_avx512vl(auVar88,auVar81);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar95,auVar89);
    auVar101 = vmulps_avx512vl(auVar101,auVar101);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar99);
    auVar98 = vmulps_avx512vl(auVar99,auVar98);
    auVar96 = vmaxps_avx512vl(auVar96,auVar98);
    auVar96 = vsqrtps_avx512vl(auVar96);
    auVar98 = vmaxps_avx512vl(auVar87,auVar94);
    auVar86 = vmaxps_avx512vl(auVar86,auVar98);
    auVar98 = vaddps_avx512vl(auVar96,auVar86);
    auVar86 = vminps_avx(auVar87,auVar94);
    auVar86 = vminps_avx(auVar84,auVar86);
    auVar86 = vsubps_avx512vl(auVar86,auVar96);
    auVar111._8_4_ = 0x3f800002;
    auVar111._0_8_ = 0x3f8000023f800002;
    auVar111._12_4_ = 0x3f800002;
    auVar111._16_4_ = 0x3f800002;
    auVar111._20_4_ = 0x3f800002;
    auVar111._24_4_ = 0x3f800002;
    auVar111._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar98,auVar111);
    auVar112._8_4_ = 0x3f7ffffc;
    auVar112._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar112._12_4_ = 0x3f7ffffc;
    auVar112._16_4_ = 0x3f7ffffc;
    auVar112._20_4_ = 0x3f7ffffc;
    auVar112._24_4_ = 0x3f7ffffc;
    auVar112._28_4_ = 0x3f7ffffc;
    local_540 = vmulps_avx512vl(auVar86,auVar112);
    auVar86 = vmulps_avx512vl(auVar84,auVar84);
    auVar84 = vrsqrt14ps_avx512vl(auVar97);
    auVar34._8_4_ = 0xbf000000;
    auVar34._0_8_ = 0xbf000000bf000000;
    auVar34._12_4_ = 0xbf000000;
    auVar34._16_4_ = 0xbf000000;
    auVar34._20_4_ = 0xbf000000;
    auVar34._24_4_ = 0xbf000000;
    auVar34._28_4_ = 0xbf000000;
    auVar87 = vmulps_avx512vl(auVar97,auVar34);
    fVar145 = auVar84._0_4_;
    fVar129 = auVar84._4_4_;
    fVar156 = auVar84._8_4_;
    fVar158 = auVar84._12_4_;
    fVar131 = auVar84._16_4_;
    fVar160 = auVar84._20_4_;
    fVar162 = auVar84._24_4_;
    auVar47._4_4_ = fVar129 * fVar129 * fVar129 * auVar87._4_4_;
    auVar47._0_4_ = fVar145 * fVar145 * fVar145 * auVar87._0_4_;
    auVar47._8_4_ = fVar156 * fVar156 * fVar156 * auVar87._8_4_;
    auVar47._12_4_ = fVar158 * fVar158 * fVar158 * auVar87._12_4_;
    auVar47._16_4_ = fVar131 * fVar131 * fVar131 * auVar87._16_4_;
    auVar47._20_4_ = fVar160 * fVar160 * fVar160 * auVar87._20_4_;
    auVar47._24_4_ = fVar162 * fVar162 * fVar162 * auVar87._24_4_;
    auVar47._28_4_ = auVar98._28_4_;
    auVar35._8_4_ = 0x3fc00000;
    auVar35._0_8_ = 0x3fc000003fc00000;
    auVar35._12_4_ = 0x3fc00000;
    auVar35._16_4_ = 0x3fc00000;
    auVar35._20_4_ = 0x3fc00000;
    auVar35._24_4_ = 0x3fc00000;
    auVar35._28_4_ = 0x3fc00000;
    auVar84 = vfmadd231ps_avx512vl(auVar47,auVar84,auVar35);
    auVar87 = vmulps_avx512vl(auVar88,auVar84);
    auVar94 = vmulps_avx512vl(auVar89,auVar84);
    auVar96 = vmulps_avx512vl(auVar85,auVar84);
    auVar205 = ZEXT1632(auVar78);
    auVar97 = vsubps_avx512vl(auVar104,auVar205);
    auVar98 = vsubps_avx512vl(auVar104,auVar93);
    auVar99 = vsubps_avx512vl(auVar104,auVar83);
    auVar100 = vmulps_avx512vl(auVar247._0_32_,auVar99);
    local_5e0 = auVar248._0_32_;
    auVar100 = vfmadd231ps_avx512vl(auVar100,local_5e0,auVar98);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar245._0_32_,auVar97);
    auVar101 = vmulps_avx512vl(auVar99,auVar99);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar98);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,auVar97);
    auVar102 = vmulps_avx512vl(auVar247._0_32_,auVar96);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,local_5e0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar87,auVar245._0_32_);
    auVar96 = vmulps_avx512vl(auVar99,auVar96);
    auVar94 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar94);
    auVar87 = vfmadd231ps_avx512vl(auVar94,auVar97,auVar87);
    auVar94 = vmulps_avx512vl(auVar102,auVar102);
    auVar96 = vsubps_avx512vl(local_1e0,auVar94);
    auVar103 = vmulps_avx512vl(auVar102,auVar87);
    auVar100 = vsubps_avx512vl(auVar100,auVar103);
    auVar100 = vaddps_avx512vl(auVar100,auVar100);
    auVar103 = vmulps_avx512vl(auVar87,auVar87);
    local_660 = vsubps_avx512vl(auVar101,auVar103);
    auVar86 = vsubps_avx512vl(local_660,auVar86);
    local_560 = vmulps_avx512vl(auVar100,auVar100);
    auVar36._8_4_ = 0x40800000;
    auVar36._0_8_ = 0x4080000040800000;
    auVar36._12_4_ = 0x40800000;
    auVar36._16_4_ = 0x40800000;
    auVar36._20_4_ = 0x40800000;
    auVar36._24_4_ = 0x40800000;
    auVar36._28_4_ = 0x40800000;
    _local_360 = vmulps_avx512vl(auVar96,auVar36);
    auVar101 = vmulps_avx512vl(_local_360,auVar86);
    auVar101 = vsubps_avx512vl(local_560,auVar101);
    uVar65 = vcmpps_avx512vl(auVar101,auVar104,5);
    bVar61 = (byte)uVar65;
    fVar145 = (float)local_5a0._0_4_;
    fVar129 = (float)local_5a0._4_4_;
    fVar156 = fStack_598;
    fVar158 = fStack_594;
    fVar131 = fStack_590;
    fVar160 = fStack_58c;
    fVar162 = fStack_588;
    fVar164 = fStack_584;
    if (bVar61 == 0) {
LAB_01d40a92:
      auVar245 = ZEXT3264(local_640);
      auVar247 = ZEXT3264(local_7a0);
      auVar227 = ZEXT3264(local_720);
      auVar229 = ZEXT3264(local_740);
      auVar231 = ZEXT3264(local_760);
      auVar234 = ZEXT3264(local_780);
      auVar220 = ZEXT3264(local_3e0);
      auVar206 = ZEXT3264(local_400);
      auVar251 = ZEXT3264(local_7c0);
      auVar238 = ZEXT3264(local_7e0);
      auVar239 = ZEXT3264(local_800);
      auVar240 = ZEXT3264(local_680);
      auVar241 = ZEXT3264(local_6a0);
      auVar242 = ZEXT3264(local_820);
      auVar243 = ZEXT3264(local_6c0);
      auVar244 = ZEXT3264(local_840);
      auVar246 = ZEXT3264(local_6e0);
      auVar249 = ZEXT3264(local_860);
    }
    else {
      auVar103 = _local_360;
      auVar101 = vsqrtps_avx512vl(auVar101);
      auVar104 = vaddps_avx512vl(auVar96,auVar96);
      local_5c0 = vrcp14ps_avx512vl(auVar104);
      auVar105 = vfnmadd213ps_avx512vl(local_5c0,auVar104,auVar105);
      auVar105 = vfmadd132ps_avx512vl(auVar105,local_5c0,local_5c0);
      auVar37._8_4_ = 0x80000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar37._12_4_ = 0x80000000;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      local_580 = vxorps_avx512vl(auVar100,auVar37);
      auVar106 = vsubps_avx512vl(local_580,auVar101);
      auVar106 = vmulps_avx512vl(auVar106,auVar105);
      auVar101 = vsubps_avx512vl(auVar101,auVar100);
      local_380 = vmulps_avx512vl(auVar101,auVar105);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar101 = vblendmps_avx512vl(auVar101,auVar106);
      auVar107._0_4_ =
           (uint)(bVar61 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar105._0_4_;
      bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar12 * auVar101._4_4_ | (uint)!bVar12 * auVar105._4_4_;
      bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar12 * auVar101._8_4_ | (uint)!bVar12 * auVar105._8_4_;
      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar12 * auVar101._12_4_ | (uint)!bVar12 * auVar105._12_4_;
      bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar12 * auVar101._16_4_ | (uint)!bVar12 * auVar105._16_4_;
      bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar12 * auVar101._20_4_ | (uint)!bVar12 * auVar105._20_4_;
      bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar12 * auVar101._24_4_ | (uint)!bVar12 * auVar105._24_4_;
      bVar12 = SUB81(uVar65 >> 7,0);
      auVar107._28_4_ = (uint)bVar12 * auVar101._28_4_ | (uint)!bVar12 * auVar105._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar105 = vblendmps_avx512vl(auVar101,local_380);
      auVar108._0_4_ =
           (uint)(bVar61 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar101._0_4_;
      bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar101._4_4_;
      bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar101._8_4_;
      bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar101._12_4_;
      bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar108._16_4_ = (uint)bVar12 * auVar105._16_4_ | (uint)!bVar12 * auVar101._16_4_;
      bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar108._20_4_ = (uint)bVar12 * auVar105._20_4_ | (uint)!bVar12 * auVar101._20_4_;
      bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar108._24_4_ = (uint)bVar12 * auVar105._24_4_ | (uint)!bVar12 * auVar101._24_4_;
      bVar12 = SUB81(uVar65 >> 7,0);
      auVar108._28_4_ = (uint)bVar12 * auVar105._28_4_ | (uint)!bVar12 * auVar101._28_4_;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar94,auVar101);
      local_3a0 = vmaxps_avx512vl(local_200,auVar101);
      auVar38._8_4_ = 0x36000000;
      auVar38._0_8_ = 0x3600000036000000;
      auVar38._12_4_ = 0x36000000;
      auVar38._16_4_ = 0x36000000;
      auVar38._20_4_ = 0x36000000;
      auVar38._24_4_ = 0x36000000;
      auVar38._28_4_ = 0x36000000;
      local_3c0 = vmulps_avx512vl(local_3a0,auVar38);
      vandps_avx512vl(auVar96,auVar101);
      uVar70 = vcmpps_avx512vl(local_3c0,local_3c0,1);
      uVar65 = uVar65 & uVar70;
      bVar64 = (byte)uVar65;
      if (bVar64 != 0) {
        uVar70 = vcmpps_avx512vl(auVar86,_DAT_01faff00,2);
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar96 = vblendmps_avx512vl(auVar86,auVar94);
        bVar11 = (byte)uVar70;
        uVar71 = (uint)(bVar11 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar11 & 1) * local_3c0._0_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        uVar122 = (uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * local_3c0._4_4_;
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        uVar123 = (uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * local_3c0._8_4_;
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        uVar124 = (uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * local_3c0._12_4_;
        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
        uVar125 = (uint)bVar12 * auVar96._16_4_ | (uint)!bVar12 * local_3c0._16_4_;
        bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
        uVar126 = (uint)bVar12 * auVar96._20_4_ | (uint)!bVar12 * local_3c0._20_4_;
        bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
        uVar127 = (uint)bVar12 * auVar96._24_4_ | (uint)!bVar12 * local_3c0._24_4_;
        bVar12 = SUB81(uVar70 >> 7,0);
        uVar128 = (uint)bVar12 * auVar96._28_4_ | (uint)!bVar12 * local_3c0._28_4_;
        auVar107._0_4_ = (bVar64 & 1) * uVar71 | !(bool)(bVar64 & 1) * auVar107._0_4_;
        bVar12 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar107._4_4_ = bVar12 * uVar122 | !bVar12 * auVar107._4_4_;
        bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar107._8_4_ = bVar12 * uVar123 | !bVar12 * auVar107._8_4_;
        bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar107._12_4_ = bVar12 * uVar124 | !bVar12 * auVar107._12_4_;
        bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar107._16_4_ = bVar12 * uVar125 | !bVar12 * auVar107._16_4_;
        bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar107._20_4_ = bVar12 * uVar126 | !bVar12 * auVar107._20_4_;
        bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar107._24_4_ = bVar12 * uVar127 | !bVar12 * auVar107._24_4_;
        bVar12 = SUB81(uVar65 >> 7,0);
        auVar107._28_4_ = bVar12 * uVar128 | !bVar12 * auVar107._28_4_;
        auVar86 = vblendmps_avx512vl(auVar94,auVar86);
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar70 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar70 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar70 >> 6) & 1);
        bVar19 = SUB81(uVar70 >> 7,0);
        auVar108._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar11 & 1) * auVar86._0_4_ | !(bool)(bVar11 & 1) * uVar71) |
             !(bool)(bVar64 & 1) * auVar108._0_4_;
        bVar13 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar108._4_4_ =
             (uint)bVar13 * ((uint)bVar12 * auVar86._4_4_ | !bVar12 * uVar122) |
             !bVar13 * auVar108._4_4_;
        bVar12 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar108._8_4_ =
             (uint)bVar12 * ((uint)bVar14 * auVar86._8_4_ | !bVar14 * uVar123) |
             !bVar12 * auVar108._8_4_;
        bVar12 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar108._12_4_ =
             (uint)bVar12 * ((uint)bVar15 * auVar86._12_4_ | !bVar15 * uVar124) |
             !bVar12 * auVar108._12_4_;
        bVar12 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar108._16_4_ =
             (uint)bVar12 * ((uint)bVar16 * auVar86._16_4_ | !bVar16 * uVar125) |
             !bVar12 * auVar108._16_4_;
        bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar108._20_4_ =
             (uint)bVar12 * ((uint)bVar17 * auVar86._20_4_ | !bVar17 * uVar126) |
             !bVar12 * auVar108._20_4_;
        bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar108._24_4_ =
             (uint)bVar12 * ((uint)bVar18 * auVar86._24_4_ | !bVar18 * uVar127) |
             !bVar12 * auVar108._24_4_;
        bVar12 = SUB81(uVar65 >> 7,0);
        auVar108._28_4_ =
             (uint)bVar12 * ((uint)bVar19 * auVar86._28_4_ | !bVar19 * uVar128) |
             !bVar12 * auVar108._28_4_;
        bVar61 = (~bVar64 | bVar11) & bVar61;
      }
      if ((bVar61 & 0x7f) == 0) {
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar250 = ZEXT3264(auVar86);
        goto LAB_01d40a92;
      }
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar82 = vxorps_avx512vl(auVar82,auVar94);
      auVar95 = vxorps_avx512vl(auVar95,auVar94);
      auVar81 = vxorps_avx512vl(auVar81,auVar94);
      auVar74 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_510);
      auVar86 = vbroadcastss_avx512vl(auVar74);
      auVar86 = vmaxps_avx512vl(auVar86,auVar107);
      auVar74 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_510);
      auVar96 = vbroadcastss_avx512vl(auVar74);
      auVar96 = vminps_avx512vl(auVar96,auVar108);
      auVar99 = vmulps_avx512vl(auVar99,auVar236);
      auVar98 = vfmadd213ps_avx512vl(auVar98,auVar235,auVar99);
      auVar74 = vfmadd213ps_fma(auVar97,auVar232,auVar98);
      auVar97 = vmulps_avx512vl(local_7a0,auVar236);
      auVar75 = vfmadd231ps_fma(auVar97,auVar235,local_5e0);
      auVar245 = ZEXT3264(local_640);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),local_640,auVar232);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar97,auVar98);
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar20 = vcmpps_avx512vl(auVar98,auVar99,1);
      auVar101 = vxorps_avx512vl(ZEXT1632(auVar74),auVar94);
      auVar105 = vrcp14ps_avx512vl(auVar97);
      auVar109 = vxorps_avx512vl(auVar97,auVar94);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = vfnmadd213ps_avx512vl(auVar105,auVar97,auVar110);
      auVar74 = vfmadd132ps_fma(auVar111,auVar105,auVar105);
      fVar188 = auVar74._0_4_ * auVar101._0_4_;
      fVar155 = auVar74._4_4_ * auVar101._4_4_;
      auVar48._4_4_ = fVar155;
      auVar48._0_4_ = fVar188;
      fVar157 = auVar74._8_4_ * auVar101._8_4_;
      auVar48._8_4_ = fVar157;
      fVar159 = auVar74._12_4_ * auVar101._12_4_;
      auVar48._12_4_ = fVar159;
      fVar161 = auVar101._16_4_ * 0.0;
      auVar48._16_4_ = fVar161;
      fVar163 = auVar101._20_4_ * 0.0;
      auVar48._20_4_ = fVar163;
      fVar165 = auVar101._24_4_ * 0.0;
      auVar48._24_4_ = fVar165;
      auVar48._28_4_ = auVar101._28_4_;
      uVar22 = vcmpps_avx512vl(auVar97,auVar109,1);
      bVar64 = (byte)uVar20 | (byte)uVar22;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar112 = vblendmps_avx512vl(auVar48,auVar111);
      auVar113._0_4_ =
           (uint)(bVar64 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar105._0_4_;
      bVar12 = (bool)(bVar64 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar12 * auVar112._4_4_ | (uint)!bVar12 * auVar105._4_4_;
      bVar12 = (bool)(bVar64 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar12 * auVar112._8_4_ | (uint)!bVar12 * auVar105._8_4_;
      bVar12 = (bool)(bVar64 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar12 * auVar112._12_4_ | (uint)!bVar12 * auVar105._12_4_;
      bVar12 = (bool)(bVar64 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar12 * auVar112._16_4_ | (uint)!bVar12 * auVar105._16_4_;
      bVar12 = (bool)(bVar64 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar12 * auVar112._20_4_ | (uint)!bVar12 * auVar105._20_4_;
      bVar12 = (bool)(bVar64 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar12 * auVar112._24_4_ | (uint)!bVar12 * auVar105._24_4_;
      auVar113._28_4_ =
           (uint)(bVar64 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar105._28_4_;
      auVar105 = vmaxps_avx512vl(auVar86,auVar113);
      uVar22 = vcmpps_avx512vl(auVar97,auVar109,6);
      bVar64 = (byte)uVar20 | (byte)uVar22;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114._0_4_ = (uint)(bVar64 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar188
      ;
      bVar12 = (bool)(bVar64 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * (int)fVar155;
      bVar12 = (bool)(bVar64 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * (int)fVar157;
      bVar12 = (bool)(bVar64 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * (int)fVar159;
      bVar12 = (bool)(bVar64 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * (int)fVar161;
      bVar12 = (bool)(bVar64 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * (int)fVar163;
      bVar12 = (bool)(bVar64 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * (int)fVar165;
      auVar114._28_4_ =
           (uint)(bVar64 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar101._28_4_;
      auVar96 = vminps_avx512vl(auVar96,auVar114);
      auVar86 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
      auVar90 = vsubps_avx(ZEXT832(0) << 0x20,auVar91);
      auVar101 = ZEXT832(0) << 0x20;
      auVar91 = vsubps_avx(auVar101,auVar92);
      auVar91 = vmulps_avx512vl(auVar91,auVar82);
      auVar90 = vfmadd231ps_avx512vl(auVar91,auVar81,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar86);
      auVar90 = vmulps_avx512vl(local_7a0,auVar82);
      auVar248 = ZEXT3264(local_5e0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_5e0,auVar81);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_640,auVar95);
      vandps_avx512vl(auVar90,auVar98);
      uVar20 = vcmpps_avx512vl(auVar90,auVar99,1);
      auVar86 = vxorps_avx512vl(auVar86,auVar94);
      auVar91 = vrcp14ps_avx512vl(auVar90);
      auVar92 = vxorps_avx512vl(auVar90,auVar94);
      auVar94 = vfnmadd213ps_avx512vl(auVar91,auVar90,auVar110);
      auVar74 = vfmadd132ps_fma(auVar94,auVar91,auVar91);
      fVar188 = auVar74._0_4_ * auVar86._0_4_;
      fVar155 = auVar74._4_4_ * auVar86._4_4_;
      auVar49._4_4_ = fVar155;
      auVar49._0_4_ = fVar188;
      fVar157 = auVar74._8_4_ * auVar86._8_4_;
      auVar49._8_4_ = fVar157;
      fVar159 = auVar74._12_4_ * auVar86._12_4_;
      auVar49._12_4_ = fVar159;
      fVar161 = auVar86._16_4_ * 0.0;
      auVar49._16_4_ = fVar161;
      fVar163 = auVar86._20_4_ * 0.0;
      auVar49._20_4_ = fVar163;
      fVar165 = auVar86._24_4_ * 0.0;
      auVar49._24_4_ = fVar165;
      auVar49._28_4_ = auVar86._28_4_;
      uVar22 = vcmpps_avx512vl(auVar90,auVar92,1);
      bVar64 = (byte)uVar20 | (byte)uVar22;
      auVar94 = vblendmps_avx512vl(auVar49,auVar111);
      auVar115._0_4_ =
           (uint)(bVar64 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar91._0_4_;
      bVar12 = (bool)(bVar64 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar91._4_4_;
      bVar12 = (bool)(bVar64 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar91._8_4_;
      bVar12 = (bool)(bVar64 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar91._12_4_;
      bVar12 = (bool)(bVar64 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar91._16_4_;
      bVar12 = (bool)(bVar64 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar91._20_4_;
      bVar12 = (bool)(bVar64 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar91._24_4_;
      auVar115._28_4_ =
           (uint)(bVar64 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar91._28_4_;
      _local_4a0 = vmaxps_avx(auVar105,auVar115);
      uVar22 = vcmpps_avx512vl(auVar90,auVar92,6);
      bVar64 = (byte)uVar20 | (byte)uVar22;
      auVar116._0_4_ = (uint)(bVar64 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar188
      ;
      bVar12 = (bool)(bVar64 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar12 * auVar97._4_4_ | (uint)!bVar12 * (int)fVar155;
      bVar12 = (bool)(bVar64 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar12 * auVar97._8_4_ | (uint)!bVar12 * (int)fVar157;
      bVar12 = (bool)(bVar64 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar12 * auVar97._12_4_ | (uint)!bVar12 * (int)fVar159;
      bVar12 = (bool)(bVar64 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar12 * auVar97._16_4_ | (uint)!bVar12 * (int)fVar161;
      bVar12 = (bool)(bVar64 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar12 * auVar97._20_4_ | (uint)!bVar12 * (int)fVar163;
      bVar12 = (bool)(bVar64 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar12 * auVar97._24_4_ | (uint)!bVar12 * (int)fVar165;
      auVar116._28_4_ =
           (uint)(bVar64 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar86._28_4_;
      local_260 = vminps_avx(auVar96,auVar116);
      auVar86 = _local_4a0;
      uVar20 = vcmpps_avx512vl(_local_4a0,local_260,2);
      bVar61 = bVar61 & 0x7f & (byte)uVar20;
      if (bVar61 == 0) {
        auVar250 = ZEXT3264(auVar110);
        goto LAB_01d40a92;
      }
      auVar90 = vmaxps_avx(auVar101,local_540);
      auVar91 = vfmadd213ps_avx512vl(auVar106,auVar102,auVar87);
      auVar91 = vmulps_avx512vl(auVar84,auVar91);
      auVar92 = vfmadd213ps_avx512vl(local_380,auVar102,auVar87);
      fVar188 = auVar84._0_4_;
      fVar155 = auVar84._4_4_;
      auVar50._4_4_ = fVar155 * auVar92._4_4_;
      auVar50._0_4_ = fVar188 * auVar92._0_4_;
      fVar157 = auVar84._8_4_;
      auVar50._8_4_ = fVar157 * auVar92._8_4_;
      fVar159 = auVar84._12_4_;
      auVar50._12_4_ = fVar159 * auVar92._12_4_;
      fVar161 = auVar84._16_4_;
      auVar50._16_4_ = fVar161 * auVar92._16_4_;
      fVar163 = auVar84._20_4_;
      auVar50._20_4_ = fVar163 * auVar92._20_4_;
      fVar165 = auVar84._24_4_;
      auVar50._24_4_ = fVar165 * auVar92._24_4_;
      auVar50._28_4_ = auVar92._28_4_;
      auVar91 = vminps_avx512vl(auVar91,auVar110);
      auVar92 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar91 = vmaxps_avx(auVar91,ZEXT832(0) << 0x20);
      auVar94 = vminps_avx512vl(auVar50,auVar110);
      auVar51._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar91._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar51,local_700,_local_8e0);
      auVar91 = vmaxps_avx(auVar94,ZEXT832(0) << 0x20);
      auVar52._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
      auVar52._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
      auVar52._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
      auVar52._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
      auVar52._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
      auVar52._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
      auVar52._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
      auVar52._28_4_ = auVar91._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar52,local_700,_local_8e0);
      auVar53._4_4_ = auVar90._4_4_ * auVar90._4_4_;
      auVar53._0_4_ = auVar90._0_4_ * auVar90._0_4_;
      auVar53._8_4_ = auVar90._8_4_ * auVar90._8_4_;
      auVar53._12_4_ = auVar90._12_4_ * auVar90._12_4_;
      auVar53._16_4_ = auVar90._16_4_ * auVar90._16_4_;
      auVar53._20_4_ = auVar90._20_4_ * auVar90._20_4_;
      auVar53._24_4_ = auVar90._24_4_ * auVar90._24_4_;
      auVar53._28_4_ = auVar90._28_4_;
      auVar91 = vsubps_avx(local_660,auVar53);
      auVar54._4_4_ = auVar91._4_4_ * (float)local_360._4_4_;
      auVar54._0_4_ = auVar91._0_4_ * (float)local_360._0_4_;
      auVar54._8_4_ = auVar91._8_4_ * fStack_358;
      auVar54._12_4_ = auVar91._12_4_ * fStack_354;
      auVar54._16_4_ = auVar91._16_4_ * fStack_350;
      auVar54._20_4_ = auVar91._20_4_ * fStack_34c;
      auVar54._24_4_ = auVar91._24_4_ * fStack_348;
      auVar54._28_4_ = auVar90._28_4_;
      auVar90 = vsubps_avx(local_560,auVar54);
      uVar65 = vcmpps_avx512vl(auVar90,ZEXT832(0) << 0x20,5);
      auVar243 = ZEXT3264(local_6c0);
      auVar246 = ZEXT3264(local_6e0);
      if ((byte)uVar65 == 0) {
        uVar65 = 0;
        auVar84 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar206 = ZEXT864(0) << 0x20;
        auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar228 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar117._8_4_ = 0x7f800000;
        auVar117._0_8_ = 0x7f8000007f800000;
        auVar117._12_4_ = 0x7f800000;
        auVar117._16_4_ = 0x7f800000;
        auVar117._20_4_ = 0x7f800000;
        auVar117._24_4_ = 0x7f800000;
        auVar117._28_4_ = 0x7f800000;
        auVar118._8_4_ = 0xff800000;
        auVar118._0_8_ = 0xff800000ff800000;
        auVar118._12_4_ = 0xff800000;
        auVar118._16_4_ = 0xff800000;
        auVar118._20_4_ = 0xff800000;
        auVar118._24_4_ = 0xff800000;
        auVar118._28_4_ = 0xff800000;
      }
      else {
        auVar75 = vxorps_avx512vl(auVar209,auVar209);
        uVar70 = vcmpps_avx512vl(auVar90,auVar101,5);
        auVar90 = vsqrtps_avx(auVar90);
        auVar92 = vfnmadd213ps_avx512vl(auVar104,local_5c0,auVar110);
        auVar95 = vfmadd132ps_avx512vl(auVar92,local_5c0,local_5c0);
        auVar92 = vsubps_avx(local_580,auVar90);
        auVar81 = vmulps_avx512vl(auVar92,auVar95);
        auVar90 = vsubps_avx512vl(auVar90,auVar100);
        auVar95 = vmulps_avx512vl(auVar90,auVar95);
        auVar90 = vfmadd213ps_avx512vl(auVar102,auVar81,auVar87);
        auVar55._4_4_ = fVar155 * auVar90._4_4_;
        auVar55._0_4_ = fVar188 * auVar90._0_4_;
        auVar55._8_4_ = fVar157 * auVar90._8_4_;
        auVar55._12_4_ = fVar159 * auVar90._12_4_;
        auVar55._16_4_ = fVar161 * auVar90._16_4_;
        auVar55._20_4_ = fVar163 * auVar90._20_4_;
        auVar55._24_4_ = fVar165 * auVar90._24_4_;
        auVar55._28_4_ = auVar94._28_4_;
        auVar90 = vmulps_avx512vl(local_640,auVar81);
        auVar92 = vmulps_avx512vl(local_5e0,auVar81);
        auVar82 = vmulps_avx512vl(local_7a0,auVar81);
        auVar94 = vfmadd213ps_avx512vl(auVar88,auVar55,auVar205);
        auVar90 = vsubps_avx512vl(auVar90,auVar94);
        auVar94 = vfmadd213ps_avx512vl(auVar89,auVar55,auVar93);
        auVar94 = vsubps_avx512vl(auVar92,auVar94);
        auVar74 = vfmadd213ps_fma(auVar55,auVar85,auVar83);
        auVar92 = vsubps_avx(auVar82,ZEXT1632(auVar74));
        auVar228 = auVar92._0_28_;
        auVar87 = vfmadd213ps_avx512vl(auVar102,auVar95,auVar87);
        auVar56._4_4_ = fVar155 * auVar87._4_4_;
        auVar56._0_4_ = fVar188 * auVar87._0_4_;
        auVar56._8_4_ = fVar157 * auVar87._8_4_;
        auVar56._12_4_ = fVar159 * auVar87._12_4_;
        auVar56._16_4_ = fVar161 * auVar87._16_4_;
        auVar56._20_4_ = fVar163 * auVar87._20_4_;
        auVar56._24_4_ = fVar165 * auVar87._24_4_;
        auVar56._28_4_ = auVar84._28_4_;
        auVar84 = vmulps_avx512vl(local_640,auVar95);
        auVar87 = vmulps_avx512vl(local_5e0,auVar95);
        auVar82 = vmulps_avx512vl(local_7a0,auVar95);
        auVar74 = vfmadd213ps_fma(auVar88,auVar56,auVar205);
        auVar92 = vsubps_avx(auVar84,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar89,auVar56,auVar93);
        auVar84 = vsubps_avx(auVar87,ZEXT1632(auVar74));
        auVar74 = vfmadd213ps_fma(auVar85,auVar56,auVar83);
        auVar87 = vsubps_avx512vl(auVar82,ZEXT1632(auVar74));
        auVar206 = ZEXT3264(auVar87);
        auVar182._8_4_ = 0x7f800000;
        auVar182._0_8_ = 0x7f8000007f800000;
        auVar182._12_4_ = 0x7f800000;
        auVar182._16_4_ = 0x7f800000;
        auVar182._20_4_ = 0x7f800000;
        auVar182._24_4_ = 0x7f800000;
        auVar182._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar182,auVar81);
        bVar12 = (bool)((byte)uVar70 & 1);
        auVar117._0_4_ = (uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * auVar78._0_4_;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * auVar78._4_4_;
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * auVar78._8_4_;
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * auVar78._12_4_;
        iVar1 = (uint)((byte)(uVar70 >> 4) & 1) * auVar87._16_4_;
        auVar117._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar70 >> 5) & 1) * auVar87._20_4_;
        auVar117._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar70 >> 6) & 1) * auVar87._24_4_;
        auVar117._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar70 >> 7) * auVar87._28_4_;
        auVar117._28_4_ = iVar4;
        auVar183._8_4_ = 0xff800000;
        auVar183._0_8_ = 0xff800000ff800000;
        auVar183._12_4_ = 0xff800000;
        auVar183._16_4_ = 0xff800000;
        auVar183._20_4_ = 0xff800000;
        auVar183._24_4_ = 0xff800000;
        auVar183._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar183,auVar95);
        bVar12 = (bool)((byte)uVar70 & 1);
        auVar118._0_4_ = (uint)bVar12 * auVar87._0_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar12 * auVar87._4_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar12 * auVar87._8_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar12 * auVar87._12_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
        auVar118._16_4_ = (uint)bVar12 * auVar87._16_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
        auVar118._20_4_ = (uint)bVar12 * auVar87._20_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
        auVar118._24_4_ = (uint)bVar12 * auVar87._24_4_ | (uint)!bVar12 * -0x800000;
        bVar12 = SUB81(uVar70 >> 7,0);
        auVar118._28_4_ = (uint)bVar12 * auVar87._28_4_ | (uint)!bVar12 * -0x800000;
        auVar39._8_4_ = 0x36000000;
        auVar39._0_8_ = 0x3600000036000000;
        auVar39._12_4_ = 0x36000000;
        auVar39._16_4_ = 0x36000000;
        auVar39._20_4_ = 0x36000000;
        auVar39._24_4_ = 0x36000000;
        auVar39._28_4_ = 0x36000000;
        auVar87 = vmulps_avx512vl(local_3a0,auVar39);
        uVar21 = vcmpps_avx512vl(auVar87,local_3c0,0xe);
        uVar70 = uVar70 & uVar21;
        bVar64 = (byte)uVar70;
        if (bVar64 != 0) {
          uVar21 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar75),2);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar233._8_4_ = 0xff800000;
          auVar233._0_8_ = 0xff800000ff800000;
          auVar233._12_4_ = 0xff800000;
          auVar233._16_4_ = 0xff800000;
          auVar233._20_4_ = 0xff800000;
          auVar233._24_4_ = 0xff800000;
          auVar233._28_4_ = 0xff800000;
          auVar88 = vblendmps_avx512vl(auVar224,auVar233);
          bVar11 = (byte)uVar21;
          uVar71 = (uint)(bVar11 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar11 & 1) * auVar87._0_4_;
          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
          uVar122 = (uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar87._4_4_;
          bVar12 = (bool)((byte)(uVar21 >> 2) & 1);
          uVar123 = (uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar87._8_4_;
          bVar12 = (bool)((byte)(uVar21 >> 3) & 1);
          uVar124 = (uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar87._12_4_;
          bVar12 = (bool)((byte)(uVar21 >> 4) & 1);
          uVar125 = (uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar87._16_4_;
          bVar12 = (bool)((byte)(uVar21 >> 5) & 1);
          uVar126 = (uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar87._20_4_;
          bVar12 = (bool)((byte)(uVar21 >> 6) & 1);
          uVar127 = (uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar87._24_4_;
          bVar12 = SUB81(uVar21 >> 7,0);
          uVar128 = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar87._28_4_;
          auVar117._0_4_ = (bVar64 & 1) * uVar71 | !(bool)(bVar64 & 1) * auVar117._0_4_;
          bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar117._4_4_ = bVar12 * uVar122 | !bVar12 * auVar117._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar117._8_4_ = bVar12 * uVar123 | !bVar12 * auVar117._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar117._12_4_ = bVar12 * uVar124 | !bVar12 * auVar117._12_4_;
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar117._16_4_ = bVar12 * uVar125 | (uint)!bVar12 * iVar1;
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar117._20_4_ = bVar12 * uVar126 | (uint)!bVar12 * iVar2;
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar117._24_4_ = bVar12 * uVar127 | (uint)!bVar12 * iVar3;
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar117._28_4_ = bVar12 * uVar128 | (uint)!bVar12 * iVar4;
          auVar87 = vblendmps_avx512vl(auVar233,auVar224);
          bVar12 = (bool)((byte)(uVar21 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar21 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar21 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar21 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar21 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
          bVar19 = SUB81(uVar21 >> 7,0);
          auVar118._0_4_ =
               (uint)(bVar64 & 1) *
               ((uint)(bVar11 & 1) * auVar87._0_4_ | !(bool)(bVar11 & 1) * uVar71) |
               !(bool)(bVar64 & 1) * auVar118._0_4_;
          bVar13 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar118._4_4_ =
               (uint)bVar13 * ((uint)bVar12 * auVar87._4_4_ | !bVar12 * uVar122) |
               !bVar13 * auVar118._4_4_;
          bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar118._8_4_ =
               (uint)bVar12 * ((uint)bVar14 * auVar87._8_4_ | !bVar14 * uVar123) |
               !bVar12 * auVar118._8_4_;
          bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar118._12_4_ =
               (uint)bVar12 * ((uint)bVar15 * auVar87._12_4_ | !bVar15 * uVar124) |
               !bVar12 * auVar118._12_4_;
          bVar12 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar118._16_4_ =
               (uint)bVar12 * ((uint)bVar16 * auVar87._16_4_ | !bVar16 * uVar125) |
               !bVar12 * auVar118._16_4_;
          bVar12 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar118._20_4_ =
               (uint)bVar12 * ((uint)bVar17 * auVar87._20_4_ | !bVar17 * uVar126) |
               !bVar12 * auVar118._20_4_;
          bVar12 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar118._24_4_ =
               (uint)bVar12 * ((uint)bVar18 * auVar87._24_4_ | !bVar18 * uVar127) |
               !bVar12 * auVar118._24_4_;
          bVar12 = SUB81(uVar70 >> 7,0);
          auVar118._28_4_ =
               (uint)bVar12 * ((uint)bVar19 * auVar87._28_4_ | !bVar19 * uVar128) |
               !bVar12 * auVar118._28_4_;
          uVar65 = (ulong)(byte)((~bVar64 | bVar11) & (byte)uVar65);
        }
      }
      auVar247 = ZEXT3264(local_7a0);
      auVar251 = ZEXT3264(local_7c0);
      auVar238 = ZEXT3264(local_7e0);
      auVar239 = ZEXT3264(local_800);
      auVar242 = ZEXT3264(local_820);
      auVar244 = ZEXT3264(local_840);
      auVar249 = ZEXT3264(local_860);
      uVar130 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar219._4_4_ = uVar130;
      auVar219._0_4_ = uVar130;
      auVar219._8_4_ = uVar130;
      auVar219._12_4_ = uVar130;
      auVar219._16_4_ = uVar130;
      auVar219._20_4_ = uVar130;
      auVar219._24_4_ = uVar130;
      auVar219._28_4_ = uVar130;
      uVar130 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar225._4_4_ = uVar130;
      auVar225._0_4_ = uVar130;
      auVar225._8_4_ = uVar130;
      auVar225._12_4_ = uVar130;
      auVar225._16_4_ = uVar130;
      auVar225._20_4_ = uVar130;
      auVar225._24_4_ = uVar130;
      auVar225._28_4_ = uVar130;
      fVar188 = (ray->super_RayK<1>).dir.field_0.m128[2];
      auVar220._0_4_ = fVar188 * auVar206._0_4_;
      auVar220._4_4_ = fVar188 * auVar206._4_4_;
      auVar220._8_4_ = fVar188 * auVar206._8_4_;
      auVar220._12_4_ = fVar188 * auVar206._12_4_;
      auVar220._16_4_ = fVar188 * auVar206._16_4_;
      auVar220._20_4_ = fVar188 * auVar206._20_4_;
      auVar220._28_36_ = auVar206._28_36_;
      auVar220._24_4_ = fVar188 * auVar206._24_4_;
      auVar74 = vfmadd231ps_fma(auVar220._0_32_,auVar225,auVar84);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar219,auVar92);
      _local_2c0 = _local_4a0;
      local_2a0 = vminps_avx(local_260,auVar117);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar84 = vandps_avx(auVar230,ZEXT1632(auVar74));
      _local_280 = vmaxps_avx(_local_4a0,auVar118);
      auVar215._8_4_ = 0x3e99999a;
      auVar215._0_8_ = 0x3e99999a3e99999a;
      auVar215._12_4_ = 0x3e99999a;
      auVar215._16_4_ = 0x3e99999a;
      auVar215._20_4_ = 0x3e99999a;
      auVar215._24_4_ = 0x3e99999a;
      auVar215._28_4_ = 0x3e99999a;
      uVar20 = vcmpps_avx512vl(auVar84,auVar215,1);
      local_8f2 = (short)uVar20;
      uVar20 = vcmpps_avx512vl(_local_4a0,local_2a0,2);
      bVar64 = (byte)uVar20 & bVar61;
      _local_340 = _local_280;
      uVar22 = vcmpps_avx512vl(_local_280,local_260,2);
      auVar240 = ZEXT3264(local_680);
      auVar241 = ZEXT3264(local_6a0);
      if ((bVar61 & ((byte)uVar22 | (byte)uVar20)) == 0) {
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar250 = ZEXT3264(auVar86);
        auVar227 = ZEXT3264(local_720);
        auVar229 = ZEXT3264(local_740);
        auVar231 = ZEXT3264(local_760);
        auVar234 = ZEXT3264(local_780);
        auVar220 = ZEXT3264(local_3e0);
        auVar206 = ZEXT3264(local_400);
      }
      else {
        auVar57._4_4_ = auVar228._4_4_ * fVar188;
        auVar57._0_4_ = auVar228._0_4_ * fVar188;
        auVar57._8_4_ = auVar228._8_4_ * fVar188;
        auVar57._12_4_ = auVar228._12_4_ * fVar188;
        auVar57._16_4_ = auVar228._16_4_ * fVar188;
        auVar57._20_4_ = auVar228._20_4_ * fVar188;
        fVar145 = local_280._28_4_;
        auVar57._24_4_ = auVar228._24_4_ * fVar188;
        auVar57._28_4_ = fVar145;
        auVar74 = vfmadd213ps_fma(auVar94,auVar225,auVar57);
        auVar74 = vfmadd213ps_fma(auVar90,auVar219,ZEXT1632(auVar74));
        auVar84 = vandps_avx(auVar230,ZEXT1632(auVar74));
        uVar20 = vcmpps_avx512vl(auVar84,auVar215,1);
        local_86c = (int)CONCAT71((int7)(uVar65 >> 8),~(byte)uVar65);
        bVar11 = (byte)uVar20 | ~(byte)uVar65;
        auVar141._8_4_ = 2;
        auVar141._0_8_ = 0x200000002;
        auVar141._12_4_ = 2;
        auVar141._16_4_ = 2;
        auVar141._20_4_ = 2;
        auVar141._24_4_ = 2;
        auVar141._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar141,auVar40);
        local_240._0_4_ = (uint)(bVar11 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar11 & 1) * 2;
        bVar12 = (bool)(bVar11 >> 1 & 1);
        local_240._4_4_ = (uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar11 >> 2 & 1);
        local_240._8_4_ = (uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar11 >> 3 & 1);
        local_240._12_4_ = (uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar11 >> 4 & 1);
        local_240._16_4_ = (uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar11 >> 5 & 1);
        local_240._20_4_ = (uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar11 >> 6 & 1);
        local_240._24_4_ = (uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * 2;
        local_240._28_4_ = (uint)(bVar11 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar11 >> 7) * 2;
        local_2e0 = vpbroadcastd_avx512vl();
        uVar20 = vpcmpd_avx512vl(local_2e0,local_240,5);
        local_868 = (uint)bVar64;
        bVar64 = (byte)uVar20 & bVar64;
        auVar227 = ZEXT3264(local_720);
        _local_360 = auVar103;
        if (bVar64 == 0) {
          fVar129 = (ray->super_RayK<1>).tfar;
          auVar143._4_4_ = fVar129;
          auVar143._0_4_ = fVar129;
          auVar143._8_4_ = fVar129;
          auVar143._12_4_ = fVar129;
          auVar143._16_4_ = fVar129;
          auVar143._20_4_ = fVar129;
          auVar143._24_4_ = fVar129;
          auVar143._28_4_ = fVar129;
          local_340._0_4_ = local_280._0_4_;
          local_340._4_4_ = local_280._4_4_;
          fStack_338 = local_280._8_4_;
          fStack_334 = local_280._12_4_;
          fStack_330 = local_280._16_4_;
          fStack_32c = local_280._20_4_;
          fStack_328 = local_280._24_4_;
          auVar229 = ZEXT3264(local_740);
          auVar231 = ZEXT3264(local_760);
          auVar234 = ZEXT3264(local_780);
          local_4a0._0_4_ = local_340._0_4_;
          local_4a0._4_4_ = local_340._4_4_;
          fStack_498 = fStack_338;
          fStack_494 = fStack_334;
          fStack_490 = fStack_330;
          fStack_48c = fStack_32c;
          fStack_488 = fStack_328;
          fStack_484 = fVar145;
        }
        else {
          auVar75 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar74 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar77 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar76 = vminps_avx(auVar75,auVar77);
          auVar75 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar77 = vmaxps_avx(auVar74,auVar75);
          auVar166._8_4_ = 0x7fffffff;
          auVar166._0_8_ = 0x7fffffff7fffffff;
          auVar166._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar76,auVar166);
          auVar75 = vandps_avx(auVar77,auVar166);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar145 = auVar74._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar77,auVar77,0xff);
          local_320 = (float)local_4a0._0_4_ + (float)local_5a0._0_4_;
          fStack_31c = (float)local_4a0._4_4_ + (float)local_5a0._4_4_;
          fStack_318 = fStack_498 + fStack_598;
          fStack_314 = fStack_494 + fStack_594;
          fStack_310 = fStack_490 + fStack_590;
          fStack_30c = fStack_48c + fStack_58c;
          fStack_308 = fStack_488 + fStack_588;
          fStack_304 = fStack_484 + fStack_584;
          _local_4a0 = auVar86;
          do {
            auVar87 = _local_8e0;
            auVar142._8_4_ = 0x7f800000;
            auVar142._0_8_ = 0x7f8000007f800000;
            auVar142._12_4_ = 0x7f800000;
            auVar142._16_4_ = 0x7f800000;
            auVar142._20_4_ = 0x7f800000;
            auVar142._24_4_ = 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar86 = vblendmps_avx512vl(auVar142,_local_4a0);
            auVar120._0_4_ =
                 (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 1 & 1);
            auVar120._4_4_ = (uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 2 & 1);
            auVar120._8_4_ = (uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 3 & 1);
            auVar120._12_4_ = (uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 4 & 1);
            auVar120._16_4_ = (uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 5 & 1);
            auVar120._20_4_ = (uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 6 & 1);
            auVar120._24_4_ = (uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * 0x7f800000;
            auVar120._28_4_ =
                 (uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
            auVar86 = vshufps_avx(auVar120,auVar120,0xb1);
            auVar86 = vminps_avx(auVar120,auVar86);
            auVar84 = vshufpd_avx(auVar86,auVar86,5);
            auVar86 = vminps_avx(auVar86,auVar84);
            auVar84 = vpermpd_avx2(auVar86,0x4e);
            auVar86 = vminps_avx(auVar86,auVar84);
            uVar20 = vcmpps_avx512vl(auVar120,auVar86,0);
            bVar62 = (byte)uVar20 & bVar64;
            bVar11 = bVar64;
            if (bVar62 != 0) {
              bVar11 = bVar62;
            }
            iVar1 = 0;
            for (uVar71 = (uint)bVar11; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            local_540._0_16_ = (undefined1  [16])aVar5;
            auVar74 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar74._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar64;
              stack0xfffffffffffff722 = auVar87._2_30_;
              local_700._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
              local_660._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar1 << 2)));
              fVar129 = sqrtf(auVar74._0_4_);
              bVar64 = local_8e0[0];
              auVar74 = local_660._0_16_;
              auVar75 = local_700._0_16_;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
              fVar129 = auVar74._0_4_;
              auVar74 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar1 << 2)));
              auVar75 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
            }
            auVar74 = vinsertps_avx(auVar74,auVar75,0x10);
            lVar66 = 5;
            do {
              uVar130 = auVar74._0_4_;
              auVar133._4_4_ = uVar130;
              auVar133._0_4_ = uVar130;
              auVar133._8_4_ = uVar130;
              auVar133._12_4_ = uVar130;
              auVar77 = vfmadd132ps_fma(auVar133,ZEXT816(0) << 0x40,local_540._0_16_);
              auVar75 = vmovshdup_avx(auVar74);
              local_3a0._0_16_ = auVar75;
              fVar162 = 1.0 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar74,auVar74,0x55);
              fVar156 = auVar75._0_4_;
              auVar167._0_4_ = local_460._0_4_ * fVar156;
              fVar158 = auVar75._4_4_;
              auVar167._4_4_ = local_460._4_4_ * fVar158;
              fVar131 = auVar75._8_4_;
              auVar167._8_4_ = local_460._8_4_ * fVar131;
              fVar160 = auVar75._12_4_;
              auVar167._12_4_ = local_460._12_4_ * fVar160;
              local_380._0_16_ = ZEXT416((uint)fVar162);
              auVar189._4_4_ = fVar162;
              auVar189._0_4_ = fVar162;
              auVar189._8_4_ = fVar162;
              auVar189._12_4_ = fVar162;
              auVar75 = vfmadd231ps_fma(auVar167,auVar189,local_420._0_16_);
              auVar201._0_4_ = local_440._0_4_ * fVar156;
              auVar201._4_4_ = local_440._4_4_ * fVar158;
              auVar201._8_4_ = local_440._8_4_ * fVar131;
              auVar201._12_4_ = local_440._12_4_ * fVar160;
              auVar76 = vfmadd231ps_fma(auVar201,auVar189,local_460._0_16_);
              auVar210._0_4_ = fVar156 * (float)local_480._0_4_;
              auVar210._4_4_ = fVar158 * (float)local_480._4_4_;
              auVar210._8_4_ = fVar131 * fStack_478;
              auVar210._12_4_ = fVar160 * fStack_474;
              auVar72 = vfmadd231ps_fma(auVar210,auVar189,local_440._0_16_);
              auVar216._0_4_ = fVar156 * auVar76._0_4_;
              auVar216._4_4_ = fVar158 * auVar76._4_4_;
              auVar216._8_4_ = fVar131 * auVar76._8_4_;
              auVar216._12_4_ = fVar160 * auVar76._12_4_;
              auVar75 = vfmadd231ps_fma(auVar216,auVar189,auVar75);
              auVar168._0_4_ = fVar156 * auVar72._0_4_;
              auVar168._4_4_ = fVar158 * auVar72._4_4_;
              auVar168._8_4_ = fVar131 * auVar72._8_4_;
              auVar168._12_4_ = fVar160 * auVar72._12_4_;
              auVar76 = vfmadd231ps_fma(auVar168,auVar189,auVar76);
              auVar202._0_4_ = fVar156 * auVar76._0_4_;
              auVar202._4_4_ = fVar158 * auVar76._4_4_;
              auVar202._8_4_ = fVar131 * auVar76._8_4_;
              auVar202._12_4_ = fVar160 * auVar76._12_4_;
              auVar72 = vfmadd231ps_fma(auVar202,auVar75,auVar189);
              auVar75 = vsubps_avx(auVar76,auVar75);
              auVar24._8_4_ = 0x40400000;
              auVar24._0_8_ = 0x4040000040400000;
              auVar24._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar75,auVar24);
              _local_360 = auVar72;
              auVar75 = vsubps_avx(auVar77,auVar72);
              _local_8e0 = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_700._0_16_ = auVar76;
              local_660._0_16_ = auVar75;
              local_560._0_16_ = auVar74;
              if (auVar75._0_4_ < 0.0) {
                auVar227._0_4_ = sqrtf(auVar75._0_4_);
                auVar227._4_60_ = extraout_var;
                auVar74 = auVar227._0_16_;
                auVar76 = local_700._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar75,auVar75);
              }
              local_3c0._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
              fVar158 = local_3c0._0_4_;
              auVar169._4_12_ = ZEXT812(0) << 0x20;
              auVar169._0_4_ = fVar158;
              local_5c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              fVar156 = local_5c0._0_4_ * 1.5;
              local_4c0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar169);
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_3c0._0_16_,auVar25);
              auVar75 = vfnmadd213ss_fma(local_4c0,local_3c0._0_16_,ZEXT416(0x40000000));
              local_580._0_4_ = auVar74._0_4_;
              if (fVar158 < auVar77._0_4_) {
                local_8b0._0_4_ = fVar156;
                fVar131 = sqrtf(fVar158);
                auVar74 = ZEXT416((uint)local_580._0_4_);
                auVar76 = local_700._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx(local_3c0._0_16_,local_3c0._0_16_);
                fVar131 = auVar77._0_4_;
                local_8b0._0_4_ = fVar156;
              }
              fVar156 = local_5c0._0_4_;
              fVar156 = (float)local_8b0._0_4_ + fVar158 * -0.5 * fVar156 * fVar156 * fVar156;
              local_8b0._0_4_ = auVar76._0_4_ * fVar156;
              local_8b0._4_4_ = auVar76._4_4_ * fVar156;
              fStack_8a8 = auVar76._8_4_ * fVar156;
              fStack_8a4 = auVar76._12_4_ * fVar156;
              local_5c0._0_16_ = vdpps_avx(_local_8b0,_local_8e0,0x7f);
              auVar78 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar134._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
              auVar134._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
              auVar134._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
              auVar134._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
              auVar77 = vsubps_avx(local_660._0_16_,auVar134);
              fVar158 = auVar77._0_4_;
              auVar146._4_12_ = ZEXT812(0) << 0x20;
              auVar146._0_4_ = fVar158;
              auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar146);
              auVar73 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
              uVar69 = fVar158 == 0.0;
              uVar68 = fVar158 < 0.0;
              if ((bool)uVar68) {
                local_4e0._0_4_ = auVar79._0_4_;
                local_4f0 = fVar156;
                fStack_4ec = fVar156;
                fStack_4e8 = fVar156;
                fStack_4e4 = fVar156;
                local_4d0 = auVar72;
                fVar158 = sqrtf(fVar158);
                auVar79 = ZEXT416((uint)local_4e0._0_4_);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar74 = ZEXT416((uint)local_580._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar72 = local_4d0;
                auVar76 = local_700._0_16_;
                fVar156 = local_4f0;
                fVar160 = fStack_4ec;
                fVar162 = fStack_4e8;
                fVar164 = fStack_4e4;
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
                fVar158 = auVar77._0_4_;
                fVar160 = fVar156;
                fVar162 = fVar156;
                fVar164 = fVar156;
              }
              auVar245 = ZEXT3264(local_640);
              auVar248 = ZEXT3264(local_5e0);
              auVar247 = ZEXT3264(local_7a0);
              auVar229 = ZEXT3264(local_740);
              auVar231 = ZEXT3264(local_760);
              auVar234 = ZEXT3264(local_780);
              auVar251 = ZEXT3264(local_7c0);
              auVar238 = ZEXT3264(local_7e0);
              auVar239 = ZEXT3264(local_800);
              auVar240 = ZEXT3264(local_680);
              auVar241 = ZEXT3264(local_6a0);
              auVar242 = ZEXT3264(local_820);
              auVar243 = ZEXT3264(local_6c0);
              auVar244 = ZEXT3264(local_840);
              auVar246 = ZEXT3264(local_6e0);
              auVar249 = ZEXT3264(local_860);
              auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_380._0_16_,
                                       local_3a0._0_16_);
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                        local_380._0_16_);
              fVar188 = auVar77._0_4_ * 6.0;
              fVar155 = local_3a0._0_4_ * 6.0;
              auVar190._0_4_ = fVar155 * (float)local_480._0_4_;
              auVar190._4_4_ = fVar155 * (float)local_480._4_4_;
              auVar190._8_4_ = fVar155 * fStack_478;
              auVar190._12_4_ = fVar155 * fStack_474;
              auVar170._4_4_ = fVar188;
              auVar170._0_4_ = fVar188;
              auVar170._8_4_ = fVar188;
              auVar170._12_4_ = fVar188;
              auVar77 = vfmadd132ps_fma(auVar170,auVar190,local_440._0_16_);
              fVar188 = auVar7._0_4_ * 6.0;
              auVar147._4_4_ = fVar188;
              auVar147._0_4_ = fVar188;
              auVar147._8_4_ = fVar188;
              auVar147._12_4_ = fVar188;
              auVar77 = vfmadd132ps_fma(auVar147,auVar77,local_460._0_16_);
              fVar188 = local_380._0_4_ * 6.0;
              auVar171._4_4_ = fVar188;
              auVar171._0_4_ = fVar188;
              auVar171._8_4_ = fVar188;
              auVar171._12_4_ = fVar188;
              auVar77 = vfmadd132ps_fma(auVar171,auVar77,local_420._0_16_);
              auVar148._0_4_ = auVar77._0_4_ * (float)local_3c0._0_4_;
              auVar148._4_4_ = auVar77._4_4_ * (float)local_3c0._0_4_;
              auVar148._8_4_ = auVar77._8_4_ * (float)local_3c0._0_4_;
              auVar148._12_4_ = auVar77._12_4_ * (float)local_3c0._0_4_;
              auVar77 = vdpps_avx(auVar76,auVar77,0x7f);
              fVar188 = auVar77._0_4_;
              auVar172._0_4_ = auVar76._0_4_ * fVar188;
              auVar172._4_4_ = auVar76._4_4_ * fVar188;
              auVar172._8_4_ = auVar76._8_4_ * fVar188;
              auVar172._12_4_ = auVar76._12_4_ * fVar188;
              auVar77 = vsubps_avx(auVar148,auVar172);
              fVar188 = auVar75._0_4_ * (float)local_4c0._0_4_;
              auVar7 = vmaxss_avx(ZEXT416((uint)fVar145),
                                  ZEXT416((uint)(local_560._0_4_ * fVar129 * 1.9073486e-06)));
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar76,auVar26);
              auVar173._0_4_ = fVar156 * auVar77._0_4_ * fVar188;
              auVar173._4_4_ = fVar160 * auVar77._4_4_ * fVar188;
              auVar173._8_4_ = fVar162 * auVar77._8_4_ * fVar188;
              auVar173._12_4_ = fVar164 * auVar77._12_4_ * fVar188;
              auVar75 = vdpps_avx(auVar80,_local_8b0,0x7f);
              auVar77 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar145),auVar7);
              auVar74 = vdpps_avx(_local_8e0,auVar173,0x7f);
              vfmadd213ss_avx512f(auVar78,ZEXT416((uint)(fVar145 / fVar131)),auVar77);
              fVar156 = auVar75._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_540._0_16_,_local_8b0,0x7f);
              auVar75 = vdpps_avx(_local_8e0,auVar80,0x7f);
              auVar77 = vmulss_avx512f(auVar79,auVar72);
              auVar72 = vmulss_avx512f(auVar72,auVar72);
              auVar78 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar77._0_4_ * auVar72._0_4_)));
              auVar77 = vdpps_avx(_local_8e0,local_540._0_16_,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar75,local_5c0._0_16_,ZEXT416((uint)fVar156));
              auVar77 = vfnmadd231ss_avx512f(auVar77,local_5c0._0_16_,auVar74);
              auVar75 = vpermilps_avx(_local_360,0xff);
              fVar158 = fVar158 - auVar75._0_4_;
              auVar72 = vshufps_avx(auVar76,auVar76,0xff);
              auVar75 = vfmsub213ss_fma(auVar73,auVar78,auVar72);
              auVar222._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                        ZEXT416((uint)fVar156),auVar77);
              auVar75 = vinsertps_avx(auVar222,auVar77,0x1c);
              auVar211._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar211._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar211._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar77 = vinsertps_avx(ZEXT416((uint)fVar156),auVar211,0x10);
              auVar191._0_4_ = auVar78._0_4_;
              auVar191._4_4_ = auVar191._0_4_;
              auVar191._8_4_ = auVar191._0_4_;
              auVar191._12_4_ = auVar191._0_4_;
              auVar74 = vdivps_avx(auVar75,auVar191);
              auVar75 = vdivps_avx(auVar77,auVar191);
              auVar77 = vbroadcastss_avx512vl(local_5c0._0_16_);
              auVar192._0_4_ = auVar77._0_4_ * auVar74._0_4_ + fVar158 * auVar75._0_4_;
              auVar192._4_4_ = auVar77._4_4_ * auVar74._4_4_ + fVar158 * auVar75._4_4_;
              auVar192._8_4_ = auVar77._8_4_ * auVar74._8_4_ + fVar158 * auVar75._8_4_;
              auVar192._12_4_ = auVar77._12_4_ * auVar74._12_4_ + fVar158 * auVar75._12_4_;
              auVar74 = vsubps_avx(local_560._0_16_,auVar192);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(local_5c0._0_16_,auVar27);
              auVar75 = vucomiss_avx512f(auVar75);
              if (!(bool)uVar68 && !(bool)uVar69) {
                auVar75 = vaddss_avx512f(auVar7,auVar75);
                auVar75 = vfmadd231ss_fma(auVar75,local_500,ZEXT416(0x36000000));
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar158),auVar28);
                if (auVar77._0_4_ < auVar75._0_4_) {
                  fVar129 = auVar74._0_4_ + (float)local_510._0_4_;
                  auVar227 = ZEXT3264(local_720);
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar129) &&
                     (fVar156 = (ray->super_RayK<1>).tfar, fVar129 <= fVar156)) {
                    auVar74 = vmovshdup_avx(auVar74);
                    fVar158 = auVar74._0_4_;
                    if ((0.0 <= fVar158) && (fVar158 <= 1.0)) {
                      auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_660._0_4_)
                                                  );
                      fVar131 = auVar74._0_4_;
                      pGVar9 = (context->scene->geometries).items[local_8f0].ptr;
                      if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar131 = fVar131 * 1.5 +
                                  (float)local_660._0_4_ * -0.5 * fVar131 * fVar131 * fVar131;
                        auVar193._0_4_ = fVar131 * (float)local_8e0._0_4_;
                        auVar193._4_4_ = fVar131 * (float)local_8e0._4_4_;
                        auVar193._8_4_ = fVar131 * fStack_8d8;
                        auVar193._12_4_ = fVar131 * fStack_8d4;
                        auVar72 = vfmadd213ps_fma(auVar72,auVar193,auVar76);
                        auVar74 = vshufps_avx(auVar193,auVar193,0xc9);
                        auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                        auVar194._0_4_ = auVar193._0_4_ * auVar75._0_4_;
                        auVar194._4_4_ = auVar193._4_4_ * auVar75._4_4_;
                        auVar194._8_4_ = auVar193._8_4_ * auVar75._8_4_;
                        auVar194._12_4_ = auVar193._12_4_ * auVar75._12_4_;
                        auVar77 = vfmsub231ps_fma(auVar194,auVar76,auVar74);
                        auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                        auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                        auVar135._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                        auVar135._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                        auVar135._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                        auVar135._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar135,auVar74,auVar75);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar129;
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          uVar20 = vmovlps_avx(auVar75);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                          (ray->Ng).field_0.field_0.z = auVar74._0_4_;
                          ray->u = fVar158;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8e8;
                          ray->geomID = (uint)local_8f0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8e0._0_4_ = fVar156;
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          local_610 = vmovlps_avx(auVar75);
                          local_608 = auVar74._0_4_;
                          local_604 = fVar158;
                          local_600 = 0;
                          local_5fc = (uint)local_8e8;
                          local_5f8 = (uint)local_8f0;
                          local_5f4 = context->user->instID[0];
                          local_5f0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar129;
                          local_8f8 = -1;
                          local_8a0.valid = &local_8f8;
                          local_8a0.geometryUserPtr = pGVar9->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_610;
                          local_8a0.N = 1;
                          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d4175d:
                            p_Var10 = context->args->filter;
                            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var10)(&local_8a0);
                              auVar249 = ZEXT3264(local_860);
                              auVar246 = ZEXT3264(local_6e0);
                              auVar244 = ZEXT3264(local_840);
                              auVar243 = ZEXT3264(local_6c0);
                              auVar242 = ZEXT3264(local_820);
                              auVar241 = ZEXT3264(local_6a0);
                              auVar240 = ZEXT3264(local_680);
                              auVar239 = ZEXT3264(local_800);
                              auVar238 = ZEXT3264(local_7e0);
                              auVar251 = ZEXT3264(local_7c0);
                              auVar234 = ZEXT3264(local_780);
                              auVar231 = ZEXT3264(local_760);
                              auVar229 = ZEXT3264(local_740);
                              auVar227 = ZEXT3264(local_720);
                              auVar247 = ZEXT3264(local_7a0);
                              auVar248 = ZEXT3264(local_5e0);
                              auVar245 = ZEXT3264(local_640);
                              if (*local_8a0.valid == 0) goto LAB_01d41889;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            (*pGVar9->intersectionFilterN)(&local_8a0);
                            auVar249 = ZEXT3264(local_860);
                            auVar246 = ZEXT3264(local_6e0);
                            auVar244 = ZEXT3264(local_840);
                            auVar243 = ZEXT3264(local_6c0);
                            auVar242 = ZEXT3264(local_820);
                            auVar241 = ZEXT3264(local_6a0);
                            auVar240 = ZEXT3264(local_680);
                            auVar239 = ZEXT3264(local_800);
                            auVar238 = ZEXT3264(local_7e0);
                            auVar251 = ZEXT3264(local_7c0);
                            auVar234 = ZEXT3264(local_780);
                            auVar231 = ZEXT3264(local_760);
                            auVar229 = ZEXT3264(local_740);
                            auVar227 = ZEXT3264(local_720);
                            auVar247 = ZEXT3264(local_7a0);
                            auVar248 = ZEXT3264(local_5e0);
                            auVar245 = ZEXT3264(local_640);
                            if (*local_8a0.valid != 0) goto LAB_01d4175d;
LAB_01d41889:
                            (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar66 = lVar66 + -1;
              auVar227 = ZEXT3264(local_720);
            } while (lVar66 != 0);
            fVar129 = (ray->super_RayK<1>).tfar;
            auVar143._4_4_ = fVar129;
            auVar143._0_4_ = fVar129;
            auVar143._8_4_ = fVar129;
            auVar143._12_4_ = fVar129;
            auVar143._16_4_ = fVar129;
            auVar143._20_4_ = fVar129;
            auVar143._24_4_ = fVar129;
            auVar143._28_4_ = fVar129;
            auVar58._4_4_ = fStack_31c;
            auVar58._0_4_ = local_320;
            auVar58._8_4_ = fStack_318;
            auVar58._12_4_ = fStack_314;
            auVar58._16_4_ = fStack_310;
            auVar58._20_4_ = fStack_30c;
            auVar58._24_4_ = fStack_308;
            auVar58._28_4_ = fStack_304;
            uVar20 = vcmpps_avx512vl(auVar143,auVar58,0xd);
            bVar64 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar64 & (byte)uVar20;
          } while (bVar64 != 0);
          fVar145 = fStack_324;
          local_4a0._0_4_ = local_280._0_4_;
          local_4a0._4_4_ = local_280._4_4_;
          fStack_498 = fStack_278;
          fStack_494 = fStack_274;
          fStack_490 = fStack_270;
          fStack_48c = fStack_26c;
          fStack_488 = fStack_268;
          fStack_484 = fStack_264;
        }
        bVar64 = (byte)local_8f2 | (byte)local_86c;
        auVar153._0_4_ = (float)local_5a0._0_4_ + (float)local_340._0_4_;
        auVar153._4_4_ = (float)local_5a0._4_4_ + (float)local_340._4_4_;
        auVar153._8_4_ = fStack_598 + fStack_338;
        auVar153._12_4_ = fStack_594 + fStack_334;
        auVar153._16_4_ = fStack_590 + fStack_330;
        auVar153._20_4_ = fStack_58c + fStack_32c;
        auVar153._24_4_ = fStack_588 + fStack_328;
        auVar153._28_4_ = fStack_584 + fVar145;
        uVar20 = vcmpps_avx512vl(auVar153,auVar143,2);
        bVar61 = (byte)uVar22 & bVar61 & (byte)uVar20;
        auVar154._8_4_ = 2;
        auVar154._0_8_ = 0x200000002;
        auVar154._12_4_ = 2;
        auVar154._16_4_ = 2;
        auVar154._20_4_ = 2;
        auVar154._24_4_ = 2;
        auVar154._28_4_ = 2;
        auVar41._8_4_ = 3;
        auVar41._0_8_ = 0x300000003;
        auVar41._12_4_ = 3;
        auVar41._16_4_ = 3;
        auVar41._20_4_ = 3;
        auVar41._24_4_ = 3;
        auVar41._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar154,auVar41);
        local_340._0_4_ = (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar12 = (bool)(bVar64 >> 1 & 1);
        local_340._4_4_ = (uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * 2;
        bVar12 = (bool)(bVar64 >> 2 & 1);
        fStack_338 = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * 2);
        bVar12 = (bool)(bVar64 >> 3 & 1);
        fStack_334 = (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * 2);
        bVar12 = (bool)(bVar64 >> 4 & 1);
        fStack_330 = (float)((uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * 2);
        bVar12 = (bool)(bVar64 >> 5 & 1);
        fStack_32c = (float)((uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * 2);
        bVar12 = (bool)(bVar64 >> 6 & 1);
        fStack_328 = (float)((uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * 2);
        fStack_324 = (float)((uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2);
        uVar20 = vpcmpd_avx512vl(local_2e0,_local_340,5);
        bVar64 = (byte)uVar20 & bVar61;
        fVar145 = (float)local_5a0._0_4_;
        fVar129 = (float)local_5a0._4_4_;
        fVar156 = fStack_598;
        fVar158 = fStack_594;
        fVar131 = fStack_590;
        fVar160 = fStack_58c;
        fVar162 = fStack_588;
        fVar164 = fStack_584;
        if (bVar64 != 0) {
          auVar75 = vminps_avx(local_420._0_16_,local_460._0_16_);
          auVar74 = vmaxps_avx(local_420._0_16_,local_460._0_16_);
          auVar77 = vminps_avx(local_440._0_16_,local_480._0_16_);
          auVar76 = vminps_avx(auVar75,auVar77);
          auVar75 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
          auVar77 = vmaxps_avx(auVar74,auVar75);
          auVar174._8_4_ = 0x7fffffff;
          auVar174._0_8_ = 0x7fffffff7fffffff;
          auVar174._12_4_ = 0x7fffffff;
          auVar74 = vandps_avx(auVar76,auVar174);
          auVar75 = vandps_avx(auVar77,auVar174);
          auVar74 = vmaxps_avx(auVar74,auVar75);
          auVar75 = vmovshdup_avx(auVar74);
          auVar75 = vmaxss_avx(auVar75,auVar74);
          auVar74 = vshufpd_avx(auVar74,auVar74,1);
          auVar74 = vmaxss_avx(auVar74,auVar75);
          fVar145 = auVar74._0_4_ * 1.9073486e-06;
          local_500 = vshufps_avx(auVar77,auVar77,0xff);
          local_320 = (float)local_5a0._0_4_ + (float)local_4a0._0_4_;
          fStack_31c = (float)local_5a0._4_4_ + (float)local_4a0._4_4_;
          fStack_318 = fStack_598 + fStack_498;
          fStack_314 = fStack_594 + fStack_494;
          fStack_310 = fStack_590 + fStack_490;
          fStack_30c = fStack_58c + fStack_48c;
          fStack_308 = fStack_588 + fStack_488;
          fStack_304 = fStack_584 + fStack_484;
          do {
            auVar87 = _local_8e0;
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar86 = vblendmps_avx512vl(auVar144,_local_4a0);
            auVar121._0_4_ =
                 (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 1 & 1);
            auVar121._4_4_ = (uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 2 & 1);
            auVar121._8_4_ = (uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 3 & 1);
            auVar121._12_4_ = (uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 4 & 1);
            auVar121._16_4_ = (uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 5 & 1);
            auVar121._20_4_ = (uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(bVar64 >> 6 & 1);
            auVar121._24_4_ = (uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * 0x7f800000;
            auVar121._28_4_ =
                 (uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
            auVar86 = vshufps_avx(auVar121,auVar121,0xb1);
            auVar86 = vminps_avx(auVar121,auVar86);
            auVar84 = vshufpd_avx(auVar86,auVar86,5);
            auVar86 = vminps_avx(auVar86,auVar84);
            auVar84 = vpermpd_avx2(auVar86,0x4e);
            auVar86 = vminps_avx(auVar86,auVar84);
            uVar20 = vcmpps_avx512vl(auVar121,auVar86,0);
            bVar62 = (byte)uVar20 & bVar64;
            bVar11 = bVar64;
            if (bVar62 != 0) {
              bVar11 = bVar62;
            }
            iVar1 = 0;
            for (uVar71 = (uint)bVar11; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
              iVar1 = iVar1 + 1;
            }
            aVar5 = (ray->super_RayK<1>).dir.field_0;
            local_540._0_16_ = (undefined1  [16])aVar5;
            auVar74 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
            if (auVar74._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar64;
              stack0xfffffffffffff722 = auVar87._2_30_;
              local_700._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
              local_660._0_16_ = ZEXT416(*(uint *)(local_260 + (uint)(iVar1 << 2)));
              fVar129 = sqrtf(auVar74._0_4_);
              bVar64 = local_8e0[0];
              auVar74 = local_660._0_16_;
              auVar75 = local_700._0_16_;
            }
            else {
              auVar74 = vsqrtss_avx(auVar74,auVar74);
              fVar129 = auVar74._0_4_;
              auVar74 = ZEXT416(*(uint *)(local_260 + (uint)(iVar1 << 2)));
              auVar75 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
            }
            auVar74 = vinsertps_avx(auVar74,auVar75,0x10);
            lVar66 = 5;
            do {
              uVar130 = auVar74._0_4_;
              auVar136._4_4_ = uVar130;
              auVar136._0_4_ = uVar130;
              auVar136._8_4_ = uVar130;
              auVar136._12_4_ = uVar130;
              auVar77 = vfmadd132ps_fma(auVar136,ZEXT816(0) << 0x40,local_540._0_16_);
              auVar75 = vmovshdup_avx(auVar74);
              local_3a0._0_16_ = auVar75;
              fVar162 = 1.0 - auVar75._0_4_;
              auVar75 = vshufps_avx(auVar74,auVar74,0x55);
              fVar156 = auVar75._0_4_;
              auVar175._0_4_ = local_460._0_4_ * fVar156;
              fVar158 = auVar75._4_4_;
              auVar175._4_4_ = local_460._4_4_ * fVar158;
              fVar131 = auVar75._8_4_;
              auVar175._8_4_ = local_460._8_4_ * fVar131;
              fVar160 = auVar75._12_4_;
              auVar175._12_4_ = local_460._12_4_ * fVar160;
              local_380._0_16_ = ZEXT416((uint)fVar162);
              auVar195._4_4_ = fVar162;
              auVar195._0_4_ = fVar162;
              auVar195._8_4_ = fVar162;
              auVar195._12_4_ = fVar162;
              auVar75 = vfmadd231ps_fma(auVar175,auVar195,local_420._0_16_);
              auVar203._0_4_ = local_440._0_4_ * fVar156;
              auVar203._4_4_ = local_440._4_4_ * fVar158;
              auVar203._8_4_ = local_440._8_4_ * fVar131;
              auVar203._12_4_ = local_440._12_4_ * fVar160;
              auVar76 = vfmadd231ps_fma(auVar203,auVar195,local_460._0_16_);
              auVar212._0_4_ = fVar156 * (float)local_480._0_4_;
              auVar212._4_4_ = fVar158 * (float)local_480._4_4_;
              auVar212._8_4_ = fVar131 * fStack_478;
              auVar212._12_4_ = fVar160 * fStack_474;
              auVar72 = vfmadd231ps_fma(auVar212,auVar195,local_440._0_16_);
              auVar217._0_4_ = fVar156 * auVar76._0_4_;
              auVar217._4_4_ = fVar158 * auVar76._4_4_;
              auVar217._8_4_ = fVar131 * auVar76._8_4_;
              auVar217._12_4_ = fVar160 * auVar76._12_4_;
              auVar75 = vfmadd231ps_fma(auVar217,auVar195,auVar75);
              auVar176._0_4_ = fVar156 * auVar72._0_4_;
              auVar176._4_4_ = fVar158 * auVar72._4_4_;
              auVar176._8_4_ = fVar131 * auVar72._8_4_;
              auVar176._12_4_ = fVar160 * auVar72._12_4_;
              auVar76 = vfmadd231ps_fma(auVar176,auVar195,auVar76);
              auVar204._0_4_ = fVar156 * auVar76._0_4_;
              auVar204._4_4_ = fVar158 * auVar76._4_4_;
              auVar204._8_4_ = fVar131 * auVar76._8_4_;
              auVar204._12_4_ = fVar160 * auVar76._12_4_;
              auVar72 = vfmadd231ps_fma(auVar204,auVar75,auVar195);
              auVar75 = vsubps_avx(auVar76,auVar75);
              auVar29._8_4_ = 0x40400000;
              auVar29._0_8_ = 0x4040000040400000;
              auVar29._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar75,auVar29);
              _local_360 = auVar72;
              auVar75 = vsubps_avx(auVar77,auVar72);
              _local_8e0 = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_700._0_16_ = auVar76;
              local_660._0_16_ = auVar75;
              local_560._0_16_ = auVar74;
              if (auVar75._0_4_ < 0.0) {
                auVar229._0_4_ = sqrtf(auVar75._0_4_);
                auVar229._4_60_ = extraout_var_00;
                auVar74 = auVar229._0_16_;
                auVar76 = local_700._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar75,auVar75);
              }
              local_3c0._0_16_ = vdpps_avx(auVar76,auVar76,0x7f);
              fVar158 = local_3c0._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar158;
              local_5c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              fVar156 = local_5c0._0_4_ * 1.5;
              local_4c0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar30._8_4_ = 0x80000000;
              auVar30._0_8_ = 0x8000000080000000;
              auVar30._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_3c0._0_16_,auVar30);
              auVar75 = vfnmadd213ss_fma(local_4c0,local_3c0._0_16_,ZEXT416(0x40000000));
              local_580._0_4_ = auVar74._0_4_;
              if (fVar158 < auVar77._0_4_) {
                local_8b0._0_4_ = fVar156;
                fVar131 = sqrtf(fVar158);
                auVar74 = ZEXT416((uint)local_580._0_4_);
                auVar76 = local_700._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx(local_3c0._0_16_,local_3c0._0_16_);
                fVar131 = auVar77._0_4_;
                local_8b0._0_4_ = fVar156;
              }
              fVar156 = local_5c0._0_4_;
              local_8b0._4_4_ =
                   (float)local_8b0._0_4_ + fVar158 * -0.5 * fVar156 * fVar156 * fVar156;
              local_8b0._0_4_ = local_8b0._4_4_;
              fStack_8a8 = (float)local_8b0._4_4_;
              fStack_8a4 = (float)local_8b0._4_4_;
              auVar237._0_4_ = auVar76._0_4_ * (float)local_8b0._4_4_;
              auVar237._4_4_ = auVar76._4_4_ * (float)local_8b0._4_4_;
              auVar237._8_4_ = auVar76._8_4_ * (float)local_8b0._4_4_;
              auVar237._12_4_ = auVar76._12_4_ * (float)local_8b0._4_4_;
              local_5c0._0_16_ = vdpps_avx(auVar237,_local_8e0,0x7f);
              auVar78 = vaddss_avx512f(auVar74,ZEXT416(0x3f800000));
              auVar137._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
              auVar137._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
              auVar137._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
              auVar137._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
              auVar77 = vsubps_avx(local_660._0_16_,auVar137);
              fVar156 = auVar77._0_4_;
              auVar149._4_12_ = ZEXT812(0) << 0x20;
              auVar149._0_4_ = fVar156;
              auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar149);
              auVar73 = vmulss_avx512f(auVar72,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar77,ZEXT416(0xbf000000));
              uVar69 = fVar156 == 0.0;
              uVar68 = fVar156 < 0.0;
              if ((bool)uVar68) {
                local_4f0 = auVar79._0_4_;
                local_4e0 = auVar237;
                local_4d0 = auVar72;
                fVar156 = sqrtf(fVar156);
                auVar79 = ZEXT416((uint)local_4f0);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar74 = ZEXT416((uint)local_580._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar237 = local_4e0;
                auVar72 = local_4d0;
                auVar76 = local_700._0_16_;
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
                fVar156 = auVar77._0_4_;
              }
              auVar245 = ZEXT3264(local_640);
              auVar248 = ZEXT3264(local_5e0);
              auVar247 = ZEXT3264(local_7a0);
              auVar229 = ZEXT3264(local_740);
              auVar231 = ZEXT3264(local_760);
              auVar234 = ZEXT3264(local_780);
              auVar251 = ZEXT3264(local_7c0);
              auVar238 = ZEXT3264(local_7e0);
              auVar239 = ZEXT3264(local_800);
              auVar240 = ZEXT3264(local_680);
              auVar241 = ZEXT3264(local_6a0);
              auVar242 = ZEXT3264(local_820);
              auVar243 = ZEXT3264(local_6c0);
              auVar244 = ZEXT3264(local_840);
              auVar246 = ZEXT3264(local_6e0);
              auVar249 = ZEXT3264(local_860);
              auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_380._0_16_,
                                       local_3a0._0_16_);
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                        local_380._0_16_);
              fVar158 = auVar77._0_4_ * 6.0;
              fVar160 = local_3a0._0_4_ * 6.0;
              auVar196._0_4_ = fVar160 * (float)local_480._0_4_;
              auVar196._4_4_ = fVar160 * (float)local_480._4_4_;
              auVar196._8_4_ = fVar160 * fStack_478;
              auVar196._12_4_ = fVar160 * fStack_474;
              auVar178._4_4_ = fVar158;
              auVar178._0_4_ = fVar158;
              auVar178._8_4_ = fVar158;
              auVar178._12_4_ = fVar158;
              auVar77 = vfmadd132ps_fma(auVar178,auVar196,local_440._0_16_);
              fVar158 = auVar7._0_4_ * 6.0;
              auVar150._4_4_ = fVar158;
              auVar150._0_4_ = fVar158;
              auVar150._8_4_ = fVar158;
              auVar150._12_4_ = fVar158;
              auVar77 = vfmadd132ps_fma(auVar150,auVar77,local_460._0_16_);
              fVar158 = local_380._0_4_ * 6.0;
              auVar179._4_4_ = fVar158;
              auVar179._0_4_ = fVar158;
              auVar179._8_4_ = fVar158;
              auVar179._12_4_ = fVar158;
              auVar77 = vfmadd132ps_fma(auVar179,auVar77,local_420._0_16_);
              auVar151._0_4_ = auVar77._0_4_ * (float)local_3c0._0_4_;
              auVar151._4_4_ = auVar77._4_4_ * (float)local_3c0._0_4_;
              auVar151._8_4_ = auVar77._8_4_ * (float)local_3c0._0_4_;
              auVar151._12_4_ = auVar77._12_4_ * (float)local_3c0._0_4_;
              auVar77 = vdpps_avx(auVar76,auVar77,0x7f);
              fVar158 = auVar77._0_4_;
              auVar180._0_4_ = auVar76._0_4_ * fVar158;
              auVar180._4_4_ = auVar76._4_4_ * fVar158;
              auVar180._8_4_ = auVar76._8_4_ * fVar158;
              auVar180._12_4_ = auVar76._12_4_ * fVar158;
              auVar77 = vsubps_avx(auVar151,auVar180);
              fVar158 = auVar75._0_4_ * (float)local_4c0._0_4_;
              auVar7 = vmaxss_avx(ZEXT416((uint)fVar145),
                                  ZEXT416((uint)(local_560._0_4_ * fVar129 * 1.9073486e-06)));
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar76,auVar31);
              auVar181._0_4_ = auVar77._0_4_ * fVar158 * (float)local_8b0._0_4_;
              auVar181._4_4_ = auVar77._4_4_ * fVar158 * (float)local_8b0._4_4_;
              auVar181._8_4_ = auVar77._8_4_ * fVar158 * fStack_8a8;
              auVar181._12_4_ = auVar77._12_4_ * fVar158 * fStack_8a4;
              auVar75 = vdpps_avx(auVar80,auVar237,0x7f);
              auVar77 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar145),auVar7);
              auVar74 = vdpps_avx(_local_8e0,auVar181,0x7f);
              vfmadd213ss_avx512f(auVar78,ZEXT416((uint)(fVar145 / fVar131)),auVar77);
              fVar158 = auVar75._0_4_ + auVar74._0_4_;
              auVar74 = vdpps_avx(local_540._0_16_,auVar237,0x7f);
              auVar75 = vdpps_avx(_local_8e0,auVar80,0x7f);
              auVar77 = vmulss_avx512f(auVar79,auVar72);
              auVar72 = vmulss_avx512f(auVar72,auVar72);
              auVar78 = vaddss_avx512f(auVar73,ZEXT416((uint)(auVar77._0_4_ * auVar72._0_4_)));
              auVar77 = vdpps_avx(_local_8e0,local_540._0_16_,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar75,local_5c0._0_16_,ZEXT416((uint)fVar158));
              auVar77 = vfnmadd231ss_avx512f(auVar77,local_5c0._0_16_,auVar74);
              auVar75 = vpermilps_avx(_local_360,0xff);
              fVar156 = fVar156 - auVar75._0_4_;
              auVar72 = vshufps_avx(auVar76,auVar76,0xff);
              auVar75 = vfmsub213ss_fma(auVar73,auVar78,auVar72);
              auVar223._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar223._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar223._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar78._0_4_));
              auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_)),
                                        ZEXT416((uint)fVar158),auVar77);
              auVar75 = vinsertps_avx(auVar223,auVar77,0x1c);
              auVar213._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar213._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar213._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar77 = vinsertps_avx(ZEXT416((uint)fVar158),auVar213,0x10);
              auVar197._0_4_ = auVar78._0_4_;
              auVar197._4_4_ = auVar197._0_4_;
              auVar197._8_4_ = auVar197._0_4_;
              auVar197._12_4_ = auVar197._0_4_;
              auVar74 = vdivps_avx(auVar75,auVar197);
              auVar75 = vdivps_avx(auVar77,auVar197);
              auVar77 = vbroadcastss_avx512vl(local_5c0._0_16_);
              auVar198._0_4_ = auVar77._0_4_ * auVar74._0_4_ + fVar156 * auVar75._0_4_;
              auVar198._4_4_ = auVar77._4_4_ * auVar74._4_4_ + fVar156 * auVar75._4_4_;
              auVar198._8_4_ = auVar77._8_4_ * auVar74._8_4_ + fVar156 * auVar75._8_4_;
              auVar198._12_4_ = auVar77._12_4_ * auVar74._12_4_ + fVar156 * auVar75._12_4_;
              auVar74 = vsubps_avx(local_560._0_16_,auVar198);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(local_5c0._0_16_,auVar32);
              auVar75 = vucomiss_avx512f(auVar75);
              if (!(bool)uVar68 && !(bool)uVar69) {
                auVar75 = vaddss_avx512f(auVar7,auVar75);
                auVar75 = vfmadd231ss_fma(auVar75,local_500,ZEXT416(0x36000000));
                auVar33._8_4_ = 0x7fffffff;
                auVar33._0_8_ = 0x7fffffff7fffffff;
                auVar33._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar156),auVar33);
                if (auVar77._0_4_ < auVar75._0_4_) {
                  fVar129 = auVar74._0_4_ + (float)local_510._0_4_;
                  auVar227 = ZEXT3264(local_720);
                  if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar129) &&
                     (fVar156 = (ray->super_RayK<1>).tfar, fVar129 <= fVar156)) {
                    auVar74 = vmovshdup_avx(auVar74);
                    fVar158 = auVar74._0_4_;
                    if ((0.0 <= fVar158) && (fVar158 <= 1.0)) {
                      auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_660._0_4_)
                                                  );
                      fVar131 = auVar74._0_4_;
                      pGVar9 = (context->scene->geometries).items[local_8f0].ptr;
                      if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                        fVar131 = fVar131 * 1.5 +
                                  (float)local_660._0_4_ * -0.5 * fVar131 * fVar131 * fVar131;
                        auVar199._0_4_ = fVar131 * (float)local_8e0._0_4_;
                        auVar199._4_4_ = fVar131 * (float)local_8e0._4_4_;
                        auVar199._8_4_ = fVar131 * fStack_8d8;
                        auVar199._12_4_ = fVar131 * fStack_8d4;
                        auVar72 = vfmadd213ps_fma(auVar72,auVar199,auVar76);
                        auVar74 = vshufps_avx(auVar199,auVar199,0xc9);
                        auVar75 = vshufps_avx(auVar76,auVar76,0xc9);
                        auVar200._0_4_ = auVar199._0_4_ * auVar75._0_4_;
                        auVar200._4_4_ = auVar199._4_4_ * auVar75._4_4_;
                        auVar200._8_4_ = auVar199._8_4_ * auVar75._8_4_;
                        auVar200._12_4_ = auVar199._12_4_ * auVar75._12_4_;
                        auVar77 = vfmsub231ps_fma(auVar200,auVar76,auVar74);
                        auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar75 = vshufps_avx(auVar72,auVar72,0xc9);
                        auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                        auVar138._0_4_ = auVar72._0_4_ * auVar77._0_4_;
                        auVar138._4_4_ = auVar72._4_4_ * auVar77._4_4_;
                        auVar138._8_4_ = auVar72._8_4_ * auVar77._8_4_;
                        auVar138._12_4_ = auVar72._12_4_ * auVar77._12_4_;
                        auVar74 = vfmsub231ps_fma(auVar138,auVar74,auVar75);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar129;
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          uVar20 = vmovlps_avx(auVar75);
                          *(undefined8 *)&(ray->Ng).field_0 = uVar20;
                          (ray->Ng).field_0.field_0.z = auVar74._0_4_;
                          ray->u = fVar158;
                          ray->v = 0.0;
                          ray->primID = (uint)local_8e8;
                          ray->geomID = (uint)local_8f0;
                          ray->instID[0] = context->user->instID[0];
                          ray->instPrimID[0] = context->user->instPrimID[0];
                        }
                        else {
                          local_8e0._0_4_ = fVar156;
                          auVar75 = vshufps_avx(auVar74,auVar74,0xe9);
                          local_610 = vmovlps_avx(auVar75);
                          local_608 = auVar74._0_4_;
                          local_604 = fVar158;
                          local_600 = 0;
                          local_5fc = (uint)local_8e8;
                          local_5f8 = (uint)local_8f0;
                          local_5f4 = context->user->instID[0];
                          local_5f0 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar129;
                          local_8f8 = -1;
                          local_8a0.valid = &local_8f8;
                          local_8a0.geometryUserPtr = pGVar9->userPtr;
                          local_8a0.context = context->user;
                          local_8a0.ray = (RTCRayN *)ray;
                          local_8a0.hit = (RTCHitN *)&local_610;
                          local_8a0.N = 1;
                          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d42346:
                            p_Var10 = context->args->filter;
                            if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var10)(&local_8a0);
                              auVar249 = ZEXT3264(local_860);
                              auVar246 = ZEXT3264(local_6e0);
                              auVar244 = ZEXT3264(local_840);
                              auVar243 = ZEXT3264(local_6c0);
                              auVar242 = ZEXT3264(local_820);
                              auVar241 = ZEXT3264(local_6a0);
                              auVar240 = ZEXT3264(local_680);
                              auVar239 = ZEXT3264(local_800);
                              auVar238 = ZEXT3264(local_7e0);
                              auVar251 = ZEXT3264(local_7c0);
                              auVar234 = ZEXT3264(local_780);
                              auVar231 = ZEXT3264(local_760);
                              auVar229 = ZEXT3264(local_740);
                              auVar227 = ZEXT3264(local_720);
                              auVar247 = ZEXT3264(local_7a0);
                              auVar248 = ZEXT3264(local_5e0);
                              auVar245 = ZEXT3264(local_640);
                              if (*local_8a0.valid == 0) goto LAB_01d42472;
                            }
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                 *(float *)local_8a0.hit;
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                 *(float *)(local_8a0.hit + 4);
                            (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                 *(float *)(local_8a0.hit + 8);
                            *(float *)((long)local_8a0.ray + 0x3c) = *(float *)(local_8a0.hit + 0xc)
                            ;
                            *(float *)((long)local_8a0.ray + 0x40) =
                                 *(float *)(local_8a0.hit + 0x10);
                            *(float *)((long)local_8a0.ray + 0x44) =
                                 *(float *)(local_8a0.hit + 0x14);
                            *(float *)((long)local_8a0.ray + 0x48) =
                                 *(float *)(local_8a0.hit + 0x18);
                            *(float *)((long)local_8a0.ray + 0x4c) =
                                 *(float *)(local_8a0.hit + 0x1c);
                            *(float *)((long)local_8a0.ray + 0x50) =
                                 *(float *)(local_8a0.hit + 0x20);
                          }
                          else {
                            (*pGVar9->intersectionFilterN)(&local_8a0);
                            auVar249 = ZEXT3264(local_860);
                            auVar246 = ZEXT3264(local_6e0);
                            auVar244 = ZEXT3264(local_840);
                            auVar243 = ZEXT3264(local_6c0);
                            auVar242 = ZEXT3264(local_820);
                            auVar241 = ZEXT3264(local_6a0);
                            auVar240 = ZEXT3264(local_680);
                            auVar239 = ZEXT3264(local_800);
                            auVar238 = ZEXT3264(local_7e0);
                            auVar251 = ZEXT3264(local_7c0);
                            auVar234 = ZEXT3264(local_780);
                            auVar231 = ZEXT3264(local_760);
                            auVar229 = ZEXT3264(local_740);
                            auVar227 = ZEXT3264(local_720);
                            auVar247 = ZEXT3264(local_7a0);
                            auVar248 = ZEXT3264(local_5e0);
                            auVar245 = ZEXT3264(local_640);
                            if (*local_8a0.valid != 0) goto LAB_01d42346;
LAB_01d42472:
                            (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar66 = lVar66 + -1;
              auVar227 = ZEXT3264(local_720);
            } while (lVar66 != 0);
            fVar129 = (ray->super_RayK<1>).tfar;
            auVar143._4_4_ = fVar129;
            auVar143._0_4_ = fVar129;
            auVar143._8_4_ = fVar129;
            auVar143._12_4_ = fVar129;
            auVar143._16_4_ = fVar129;
            auVar143._20_4_ = fVar129;
            auVar143._24_4_ = fVar129;
            auVar143._28_4_ = fVar129;
            auVar59._4_4_ = fStack_31c;
            auVar59._0_4_ = local_320;
            auVar59._8_4_ = fStack_318;
            auVar59._12_4_ = fStack_314;
            auVar59._16_4_ = fStack_310;
            auVar59._20_4_ = fStack_30c;
            auVar59._24_4_ = fStack_308;
            auVar59._28_4_ = fStack_304;
            uVar20 = vcmpps_avx512vl(auVar143,auVar59,0xd);
            bVar64 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar64 & (byte)uVar20;
          } while (bVar64 != 0);
          local_4a0._0_4_ = local_280._0_4_;
          local_4a0._4_4_ = local_280._4_4_;
          fStack_498 = fStack_278;
          fStack_494 = fStack_274;
          fStack_490 = fStack_270;
          fStack_48c = fStack_26c;
          fStack_488 = fStack_268;
          fStack_484 = fStack_264;
          fVar145 = (float)local_5a0._0_4_;
          fVar129 = (float)local_5a0._4_4_;
          fVar156 = fStack_598;
          fVar158 = fStack_594;
          fVar131 = fStack_590;
          fVar160 = fStack_58c;
          fVar162 = fStack_588;
          fVar164 = fStack_584;
        }
        uVar22 = vpcmpgtd_avx512vl(_local_340,local_2e0);
        uVar23 = vpcmpd_avx512vl(local_2e0,local_240,1);
        auVar186._0_4_ = fVar145 + (float)local_2c0._0_4_;
        auVar186._4_4_ = fVar129 + (float)local_2c0._4_4_;
        auVar186._8_4_ = fVar156 + fStack_2b8;
        auVar186._12_4_ = fVar158 + fStack_2b4;
        auVar186._16_4_ = fVar131 + fStack_2b0;
        auVar186._20_4_ = fVar160 + fStack_2ac;
        auVar186._24_4_ = fVar162 + fStack_2a8;
        auVar186._28_4_ = fVar164 + fStack_2a4;
        uVar20 = vcmpps_avx512vl(auVar186,auVar143,2);
        bVar64 = (byte)local_868 & (byte)uVar23 & (byte)uVar20;
        auVar187._0_4_ = fVar145 + (float)local_4a0._0_4_;
        auVar187._4_4_ = fVar129 + (float)local_4a0._4_4_;
        auVar187._8_4_ = fVar156 + fStack_498;
        auVar187._12_4_ = fVar158 + fStack_494;
        auVar187._16_4_ = fVar131 + fStack_490;
        auVar187._20_4_ = fVar160 + fStack_48c;
        auVar187._24_4_ = fVar162 + fStack_488;
        auVar187._28_4_ = fVar164 + fStack_484;
        uVar20 = vcmpps_avx512vl(auVar187,auVar143,2);
        bVar61 = bVar61 & (byte)uVar22 & (byte)uVar20 | bVar64;
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar250 = ZEXT3264(auVar86);
        auVar220 = ZEXT3264(local_3e0);
        auVar206 = ZEXT3264(local_400);
        prim = local_4a8;
        if (bVar61 != 0) {
          abStack_180[uVar63 * 0x60] = bVar61;
          bVar12 = (bool)(bVar64 >> 1 & 1);
          bVar13 = (bool)(bVar64 >> 2 & 1);
          bVar14 = (bool)(bVar64 >> 3 & 1);
          bVar15 = (bool)(bVar64 >> 4 & 1);
          bVar16 = (bool)(bVar64 >> 5 & 1);
          bVar17 = (bool)(bVar64 >> 6 & 1);
          auStack_160[uVar63 * 0x18] =
               (uint)(bVar64 & 1) * local_2c0._0_4_ | (uint)!(bool)(bVar64 & 1) * local_4a0._0_4_;
          auStack_160[uVar63 * 0x18 + 1] =
               (uint)bVar12 * local_2c0._4_4_ | (uint)!bVar12 * local_4a0._4_4_;
          auStack_160[uVar63 * 0x18 + 2] =
               (uint)bVar13 * (int)fStack_2b8 | (uint)!bVar13 * (int)fStack_498;
          auStack_160[uVar63 * 0x18 + 3] =
               (uint)bVar14 * (int)fStack_2b4 | (uint)!bVar14 * (int)fStack_494;
          auStack_160[uVar63 * 0x18 + 4] =
               (uint)bVar15 * (int)fStack_2b0 | (uint)!bVar15 * (int)fStack_490;
          auStack_160[uVar63 * 0x18 + 5] =
               (uint)bVar16 * (int)fStack_2ac | (uint)!bVar16 * (int)fStack_48c;
          auStack_160[uVar63 * 0x18 + 6] =
               (uint)bVar17 * (int)fStack_2a8 | (uint)!bVar17 * (int)fStack_488;
          auStack_160[uVar63 * 0x18 + 7] =
               (uint)(bVar64 >> 7) * (int)fStack_2a4 | (uint)!(bool)(bVar64 >> 7) * (int)fStack_484;
          uVar65 = vmovlps_avx(local_2f0);
          (&uStack_140)[uVar63 * 0xc] = uVar65;
          aiStack_138[uVar63 * 0x18] = local_864 + 1;
          uVar63 = (ulong)((int)uVar63 + 1);
        }
      }
    }
    fVar188 = (ray->super_RayK<1>).tfar;
    auVar139._4_4_ = fVar188;
    auVar139._0_4_ = fVar188;
    auVar139._8_4_ = fVar188;
    auVar139._12_4_ = fVar188;
    auVar139._16_4_ = fVar188;
    auVar139._20_4_ = fVar188;
    auVar139._24_4_ = fVar188;
    auVar139._28_4_ = fVar188;
    do {
      uVar71 = (uint)uVar63;
      uVar63 = (ulong)(uVar71 - 1);
      if (uVar71 == 0) {
        uVar20 = vcmpps_avx512vl(auVar139,local_220,0xd);
        uVar71 = (uint)uVar67 & (uint)uVar20;
        uVar67 = (ulong)uVar71;
        if (uVar71 == 0) {
          return;
        }
        goto LAB_01d3fe7e;
      }
      auVar86 = *(undefined1 (*) [32])(auStack_160 + uVar63 * 0x18);
      auVar184._0_4_ = fVar145 + auVar86._0_4_;
      auVar184._4_4_ = fVar129 + auVar86._4_4_;
      auVar184._8_4_ = fVar156 + auVar86._8_4_;
      auVar184._12_4_ = fVar158 + auVar86._12_4_;
      auVar184._16_4_ = fVar131 + auVar86._16_4_;
      auVar184._20_4_ = fVar160 + auVar86._20_4_;
      auVar184._24_4_ = fVar162 + auVar86._24_4_;
      auVar184._28_4_ = fVar164 + auVar86._28_4_;
      uVar20 = vcmpps_avx512vl(auVar184,auVar139,2);
      uVar122 = (uint)uVar20 & (uint)abStack_180[uVar63 * 0x60];
    } while (uVar122 == 0);
    uVar65 = (&uStack_140)[uVar63 * 0xc];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar65;
    auVar185._8_4_ = 0x7f800000;
    auVar185._0_8_ = 0x7f8000007f800000;
    auVar185._12_4_ = 0x7f800000;
    auVar185._16_4_ = 0x7f800000;
    auVar185._20_4_ = 0x7f800000;
    auVar185._24_4_ = 0x7f800000;
    auVar185._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar185,auVar86);
    bVar61 = (byte)uVar122;
    auVar119._0_4_ =
         (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar86._0_4_;
    bVar12 = (bool)((byte)(uVar122 >> 1) & 1);
    auVar119._4_4_ = (uint)bVar12 * auVar84._4_4_ | (uint)!bVar12 * (int)auVar86._4_4_;
    bVar12 = (bool)((byte)(uVar122 >> 2) & 1);
    auVar119._8_4_ = (uint)bVar12 * auVar84._8_4_ | (uint)!bVar12 * (int)auVar86._8_4_;
    bVar12 = (bool)((byte)(uVar122 >> 3) & 1);
    auVar119._12_4_ = (uint)bVar12 * auVar84._12_4_ | (uint)!bVar12 * (int)auVar86._12_4_;
    bVar12 = (bool)((byte)(uVar122 >> 4) & 1);
    auVar119._16_4_ = (uint)bVar12 * auVar84._16_4_ | (uint)!bVar12 * (int)auVar86._16_4_;
    bVar12 = (bool)((byte)(uVar122 >> 5) & 1);
    auVar119._20_4_ = (uint)bVar12 * auVar84._20_4_ | (uint)!bVar12 * (int)auVar86._20_4_;
    bVar12 = (bool)((byte)(uVar122 >> 6) & 1);
    auVar119._24_4_ = (uint)bVar12 * auVar84._24_4_ | (uint)!bVar12 * (int)auVar86._24_4_;
    auVar119._28_4_ =
         (uVar122 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar122 >> 7,0) * (int)auVar86._28_4_;
    auVar86 = vshufps_avx(auVar119,auVar119,0xb1);
    auVar86 = vminps_avx(auVar119,auVar86);
    auVar84 = vshufpd_avx(auVar86,auVar86,5);
    auVar86 = vminps_avx(auVar86,auVar84);
    auVar84 = vpermpd_avx2(auVar86,0x4e);
    auVar86 = vminps_avx(auVar86,auVar84);
    uVar20 = vcmpps_avx512vl(auVar119,auVar86,0);
    bVar64 = (byte)uVar20 & bVar61;
    if (bVar64 != 0) {
      uVar122 = (uint)bVar64;
    }
    uVar123 = 0;
    for (; (uVar122 & 1) == 0; uVar122 = uVar122 >> 1 | 0x80000000) {
      uVar123 = uVar123 + 1;
    }
    local_864 = aiStack_138[uVar63 * 0x18];
    bVar61 = ~('\x01' << ((byte)uVar123 & 0x1f)) & bVar61;
    abStack_180[uVar63 * 0x60] = bVar61;
    if (bVar61 == 0) {
      uVar71 = uVar71 - 1;
    }
    uVar130 = (undefined4)uVar65;
    auVar152._4_4_ = uVar130;
    auVar152._0_4_ = uVar130;
    auVar152._8_4_ = uVar130;
    auVar152._12_4_ = uVar130;
    auVar152._16_4_ = uVar130;
    auVar152._20_4_ = uVar130;
    auVar152._24_4_ = uVar130;
    auVar152._28_4_ = uVar130;
    auVar74 = vmovshdup_avx(auVar132);
    auVar74 = vsubps_avx(auVar74,auVar132);
    auVar140._0_4_ = auVar74._0_4_;
    auVar140._4_4_ = auVar140._0_4_;
    auVar140._8_4_ = auVar140._0_4_;
    auVar140._12_4_ = auVar140._0_4_;
    auVar140._16_4_ = auVar140._0_4_;
    auVar140._20_4_ = auVar140._0_4_;
    auVar140._24_4_ = auVar140._0_4_;
    auVar140._28_4_ = auVar140._0_4_;
    auVar74 = vfmadd132ps_fma(auVar140,auVar152,_DAT_01faff20);
    _local_2c0 = ZEXT1632(auVar74);
    local_2f0._8_8_ = 0;
    local_2f0._0_8_ = *(ulong *)(local_2c0 + (ulong)uVar123 * 4);
    uVar63 = (ulong)uVar71;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }